

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

void compact_upto_test(bool multi_kv)

{
  fdb_encryption_key *__s;
  short *psVar1;
  size_t *psVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  fdb_kvs_handle *pfVar8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar9;
  __atomic_base<unsigned_long> doc;
  fdb_kvs_handle *pfVar10;
  fdb_kvs_config *kvs_config_00;
  fdb_kvs_commit_marker_t *pfVar11;
  fdb_file_info *kvs_config_01;
  char *pcVar12;
  void *__s2;
  code *__s_00;
  long lVar13;
  list *ptr_handle;
  fdb_kvs_handle **ppfVar14;
  uint uVar15;
  fdb_kvs_handle *pfVar16;
  fdb_file_info *info;
  undefined7 in_register_00000039;
  fdb_kvs_handle *pfVar17;
  undefined1 handle [8];
  fdb_kvs_handle *handle_00;
  ulong uVar18;
  __atomic_base<unsigned_long> _Var19;
  filemgr *ptr_fhandle;
  fdb_config *pfVar20;
  ulong uVar21;
  char *pcVar22;
  char *pcVar23;
  btree *ptr_fhandle_00;
  fdb_doc **doc_00;
  timeval tVar24;
  timeval tVar25;
  fdb_snapshot_info_t *markers;
  fdb_file_handle *dbfile;
  uint64_t num_markers;
  char kv_name [8];
  fdb_kvs_handle *snapshot;
  char compact_filename [32];
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_16260;
  undefined1 auStack_16258 [16];
  undefined1 auStack_16248 [8];
  undefined1 auStack_16240 [80];
  ulong uStack_161f0;
  timeval tStack_161d0;
  fdb_file_info afStack_161c0 [3];
  fdb_file_info afStack_160c0 [3];
  fdb_config fStack_15fc0;
  filemgr *pfStack_15ec8;
  fdb_kvs_handle *pfStack_15ec0;
  fdb_kvs_handle *pfStack_15eb8;
  fdb_config *pfStack_15eb0;
  fdb_kvs_handle *pfStack_15ea8;
  fdb_kvs_handle *pfStack_15ea0;
  fdb_file_handle *pfStack_15e90;
  fdb_kvs_handle *pfStack_15e88;
  timeval atStack_15e80 [2];
  timeval tStack_15e60;
  timeval tStack_15e50;
  undefined1 auStack_15e40 [70];
  undefined1 uStack_15dfa;
  undefined8 uStack_15df0;
  filemgr *pfStack_15d30;
  fdb_kvs_handle *pfStack_15d28;
  fdb_kvs_handle *pfStack_15d20;
  filemgr *pfStack_15d18;
  fdb_kvs_handle *pfStack_15d10;
  fdb_kvs_handle *pfStack_15d08;
  undefined1 auStack_15cf8 [8];
  undefined1 auStack_15cf0 [8];
  undefined1 auStack_15ce8 [8];
  undefined1 auStack_15ce0 [16];
  undefined1 auStack_15cd0 [16];
  fdb_kvs_config fStack_15cc0;
  atomic<unsigned_long> aStack_15ca8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_15ca0;
  __atomic_base<unsigned_long> _Stack_15c98;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_15c90;
  undefined1 auStack_15c88 [8];
  undefined1 auStack_15c80 [16];
  undefined1 auStack_15c70 [16];
  atomic<unsigned_long> aStack_15c60;
  fdb_open_flags fStack_15c4c;
  ushort uStack_15c42;
  filemgr *pfStack_15c38;
  atomic<unsigned_long> aStack_15bf8;
  undefined1 auStack_15b78 [16];
  timeval tStack_15b68;
  undefined1 auStack_15b58 [328];
  char acStack_15a10 [256];
  char acStack_15910 [256];
  fdb_kvs_handle afStack_15810 [153];
  fdb_kvs_handle *pfStack_1f48;
  fdb_kvs_handle *pfStack_1f40;
  list *plStack_1f38;
  void *pvStack_1f30;
  fdb_kvs_config fStack_1f28;
  fdb_kvs_info fStack_1f10;
  timeval tStack_1ee0;
  fdb_config fStack_1ed0;
  char acStack_1dd8 [256];
  fdb_kvs_handle afStack_1cd8 [2];
  fdb_kvs_handle **ppfStack_17b0;
  fdb_kvs_handle *pfStack_17a8;
  fdb_kvs_handle *pfStack_17a0;
  fdb_kvs_config *pfStack_1798;
  fdb_kvs_handle *pfStack_1790;
  fdb_kvs_handle *pfStack_1788;
  undefined1 auStack_1770 [16];
  undefined1 auStack_1760 [32];
  fdb_kvs_handle *pfStack_1740;
  fdb_kvs_config fStack_1738;
  fdb_kvs_info fStack_1720;
  timeval tStack_16f0;
  char acStack_16e0 [256];
  undefined1 auStack_15e0 [752];
  char acStack_12f0 [256];
  fdb_kvs_handle fStack_11f0;
  fdb_doc **ppfStack_fe8;
  fdb_kvs_handle *pfStack_fe0;
  undefined1 auStack_fc8 [16];
  fdb_doc *pfStack_fb8;
  fdb_kvs_handle *pfStack_fb0;
  fdb_doc *apfStack_fa8 [11];
  timeval tStack_f50;
  undefined1 auStack_f40 [536];
  char acStack_d28 [256];
  stat sStack_c28;
  fdb_config fStack_b98;
  fdb_kvs_handle **ppfStack_aa0;
  fdb_kvs_handle *pfStack_a98;
  fdb_kvs_handle *pfStack_a90;
  fdb_kvs_handle *pfStack_a88;
  btree *pbStack_a80;
  fdb_kvs_handle *pfStack_a78;
  fdb_kvs_handle *pfStack_a68;
  fdb_kvs_handle *pfStack_a60;
  fdb_file_handle *pfStack_a58;
  fdb_kvs_handle *pfStack_a50;
  undefined1 auStack_a48 [32];
  undefined1 auStack_a28 [40];
  fdb_file_info fStack_a00;
  fdb_config fStack_9b8;
  btree abStack_8c0 [4];
  char acStack_7c0 [256];
  char acStack_6c0 [264];
  code *pcStack_5b8;
  fdb_kvs_handle *pfStack_5b0;
  fdb_kvs_handle *pfStack_5a8;
  char *pcStack_5a0;
  char *pcStack_598;
  fdb_kvs_handle *pfStack_590;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 local_578;
  fdb_file_handle *local_570;
  fdb_kvs_handle *local_568;
  int local_55c;
  undefined1 local_558 [64];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 local_518;
  fdb_kvs_config local_4f0;
  timeval local_4d8;
  char local_4c8 [256];
  fdb_doc *local_3c8 [20];
  undefined1 local_328 [520];
  undefined8 local_120;
  undefined8 local_118;
  undefined4 local_104;
  undefined1 local_f9;
  undefined1 local_e8;
  undefined8 local_70;
  
  pfStack_590 = (fdb_kvs_handle *)0x10e36b;
  gettimeofday(&local_4d8,(__timezone_ptr_t)0x0);
  pfStack_590 = (fdb_kvs_handle *)0x10e370;
  memleak_start();
  pfStack_590 = (fdb_kvs_handle *)0x10e380;
  fdb_get_default_config();
  pfStack_590 = (fdb_kvs_handle *)0x10e38d;
  fdb_get_default_kvs_config();
  local_120 = 0;
  local_118 = 0x400;
  local_104 = 1;
  local_f9 = 0;
  local_70 = 0;
  pfStack_590 = (fdb_kvs_handle *)0x10e3bb;
  local_e8 = multi_kv;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_590 = (fdb_kvs_handle *)0x10e3cf;
  fdb_open(&local_570,"./compact_test1",(fdb_config *)(local_328 + 0x200));
  local_55c = (int)CONCAT71(in_register_00000039,multi_kv);
  if (local_55c == 0) {
    pfStack_590 = (fdb_kvs_handle *)0x10e441;
    fdb_kvs_open_default(local_570,(fdb_kvs_handle **)(local_558 + 0x20),&local_4f0);
    uVar15 = 1;
  }
  else {
    ppfVar14 = (fdb_kvs_handle **)(local_558 + 0x20);
    uVar18 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x10e403;
      sprintf(local_558,"kv%d",uVar18 & 0xffffffff);
      pfStack_590 = (fdb_kvs_handle *)0x10e416;
      fdb_kvs_open(local_570,ppfVar14,local_558,&local_4f0);
      uVar18 = uVar18 + 1;
      ppfVar14 = ppfVar14 + 1;
    } while (uVar18 != 4);
    uVar15 = 4;
  }
  pcVar12 = (char *)(ulong)uVar15;
  uVar18 = 0;
  do {
    pfStack_590 = (fdb_kvs_handle *)0x10e466;
    sprintf(local_328 + 0x100,"key%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x10e47e;
    sprintf(local_328,"meta%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x10e496;
    sprintf(local_4c8,"body%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x10e4a9;
    sVar5 = strlen(local_328 + 0x100);
    pfStack_590 = (fdb_kvs_handle *)0x10e4bc;
    sVar6 = strlen(local_328);
    pfStack_590 = (fdb_kvs_handle *)0x10e4cc;
    sVar7 = strlen(local_4c8);
    pfStack_590 = (fdb_kvs_handle *)0x10e4f1;
    fdb_doc_create(local_3c8 + uVar18,local_328 + 0x100,sVar5,local_328,sVar6,local_4c8,sVar7);
    lVar13 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x10e501;
      fdb_set(*(fdb_kvs_handle **)(local_558 + lVar13 * 8 + 0x20),local_3c8[uVar18]);
      lVar13 = lVar13 + 1;
    } while (pcVar12 != (char *)lVar13);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 5);
  pfStack_590 = (fdb_kvs_handle *)0x10e525;
  fdb_commit(local_570,'\x01');
  uVar18 = 5;
  do {
    pfStack_590 = (fdb_kvs_handle *)0x10e545;
    sprintf(local_328 + 0x100,"key%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x10e55d;
    sprintf(local_328,"meta%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x10e575;
    sprintf(local_4c8,"body%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x10e588;
    sVar5 = strlen(local_328 + 0x100);
    pfStack_590 = (fdb_kvs_handle *)0x10e59b;
    sVar6 = strlen(local_328);
    pfStack_590 = (fdb_kvs_handle *)0x10e5ab;
    sVar7 = strlen(local_4c8);
    pfStack_590 = (fdb_kvs_handle *)0x10e5d0;
    fdb_doc_create(local_3c8 + uVar18,local_328 + 0x100,sVar5,local_328,sVar6,local_4c8,sVar7);
    lVar13 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x10e5e1;
      fdb_set(*(fdb_kvs_handle **)(local_558 + lVar13 * 8 + 0x20),local_3c8[uVar18]);
      lVar13 = lVar13 + 1;
    } while (pcVar12 != (char *)lVar13);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 10);
  pfStack_590 = (fdb_kvs_handle *)0x10e602;
  fdb_commit(local_570,'\0');
  uVar18 = 10;
  do {
    pfStack_590 = (fdb_kvs_handle *)0x10e622;
    sprintf(local_328 + 0x100,"key%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x10e63a;
    sprintf(local_328,"meta%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x10e652;
    sprintf(local_4c8,"body%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x10e665;
    sVar5 = strlen(local_328 + 0x100);
    pfStack_590 = (fdb_kvs_handle *)0x10e678;
    sVar6 = strlen(local_328);
    pfStack_590 = (fdb_kvs_handle *)0x10e688;
    sVar7 = strlen(local_4c8);
    pfStack_590 = (fdb_kvs_handle *)0x10e6ad;
    fdb_doc_create(local_3c8 + uVar18,local_328 + 0x100,sVar5,local_328,sVar6,local_4c8,sVar7);
    lVar13 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x10e6be;
      fdb_set(*(fdb_kvs_handle **)(local_558 + lVar13 * 8 + 0x20),local_3c8[uVar18]);
      lVar13 = lVar13 + 1;
    } while (pcVar12 != (char *)lVar13);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 0xf);
  pfStack_590 = (fdb_kvs_handle *)0x10e6e2;
  fdb_commit(local_570,'\x01');
  uVar18 = 0xf;
  do {
    pfStack_590 = (fdb_kvs_handle *)0x10e702;
    sprintf(local_328 + 0x100,"key%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x10e71a;
    sprintf(local_328,"meta%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x10e732;
    sprintf(local_4c8,"body%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x10e745;
    pfVar8 = (fdb_kvs_handle *)strlen(local_328 + 0x100);
    doc._M_i = (__int_type_conflict)local_328;
    pfStack_590 = (fdb_kvs_handle *)0x10e758;
    sVar5 = strlen((char *)doc._M_i);
    pfStack_590 = (fdb_kvs_handle *)0x10e768;
    sVar6 = strlen(local_4c8);
    pfStack_590 = (fdb_kvs_handle *)0x10e78d;
    fdb_doc_create(local_3c8 + uVar18,local_328 + 0x100,(size_t)pfVar8,(void *)doc._M_i,sVar5,
                   local_4c8,sVar6);
    lVar13 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x10e79e;
      fdb_set(*(fdb_kvs_handle **)(local_558 + lVar13 * 8 + 0x20),local_3c8[uVar18]);
      lVar13 = lVar13 + 1;
    } while (pcVar12 != (char *)lVar13);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 0x14);
  handle_00 = (fdb_kvs_handle *)0x0;
  pfStack_590 = (fdb_kvs_handle *)0x10e7c2;
  fdb_commit(local_570,'\0');
  __s_00 = logCallbackFunc;
  pcVar22 = "compact_upto_test";
  do {
    pfStack_590 = (fdb_kvs_handle *)0x10e7e0;
    fVar3 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(local_558 + (long)handle_00 * 8 + 0x20),logCallbackFunc,
                       "compact_upto_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eb2a;
    handle_00 = (fdb_kvs_handle *)&(handle_00->kvs_config).field_0x1;
  } while ((fdb_kvs_handle *)pcVar12 != handle_00);
  pfStack_590 = (fdb_kvs_handle *)0x10e804;
  fVar3 = fdb_get_all_snap_markers
                    (local_570,(fdb_snapshot_info_t **)&local_578.seqtree,(uint64_t *)&local_568);
  pcVar23 = pcVar22;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eb2f;
  if ((char)local_55c == '\0') {
    if (local_568 != (fdb_kvs_handle *)0x4) {
      pfStack_590 = (fdb_kvs_handle *)0x10e92b;
      compact_upto_test();
    }
    handle_00 = (fdb_kvs_handle *)0x1400000000;
    doc._M_i = 0;
    pfVar8 = (fdb_kvs_handle *)0xfffffffb00000000;
    pcVar12 = local_558 + 0x40;
    pcVar23 = (char *)0x0;
    aVar9 = local_578;
    do {
      if (*(long *)((long)&(aVar9.seqtree)->root_bid + doc._M_i) != 1) {
        pfStack_590 = (fdb_kvs_handle *)0x10e98d;
        compact_upto_test();
        aVar9 = local_518;
      }
      if (*(long *)(*(long *)((long)&(aVar9.seqtree)->blk_handle + doc._M_i) + 8) !=
          (long)handle_00 >> 0x20) {
        pfStack_590 = (fdb_kvs_handle *)0x10e9a2;
        compact_upto_test();
        aVar9 = local_518;
      }
      pcVar23 = (char *)((long)pcVar23 + 1);
      handle_00 = (fdb_kvs_handle *)(handle_00[-0x2762763].config.encryption_key.bytes + 0x14);
      doc._M_i = doc._M_i + 0x18;
    } while (pcVar23 < local_568);
    __s_00 = (code *)(local_558 + 0x40);
    pfStack_590 = (fdb_kvs_handle *)0x10e9c4;
    sprintf((char *)__s_00,"compact_test_compact%d",1);
    pfStack_590 = (fdb_kvs_handle *)0x10e9da;
    fVar3 = fdb_compact_upto(local_570,(char *)__s_00,
                             (fdb_snapshot_marker_t)(local_578.seqtree)->blk_ops);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_590 = (fdb_kvs_handle *)0x10e9fe;
      fVar3 = fdb_snapshot_open((fdb_kvs_handle *)local_558._32_8_,
                                (fdb_kvs_handle **)(local_558 + 0x18),
                                (fdb_seqnum_t)(local_578.seqtrie)->btree_blk_ops->blk_alloc_sub);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_590 = (fdb_kvs_handle *)0x10ea07;
        compact_upto_test();
        goto LAB_0010ea07;
      }
LAB_0010ea64:
      __s_00 = (code *)(local_558 + 0x40);
      pfStack_590 = (fdb_kvs_handle *)0x10ea6e;
      fdb_kvs_close((fdb_kvs_handle *)local_558._24_8_);
      pfStack_590 = (fdb_kvs_handle *)0x10ea7d;
      fVar3 = fdb_free_snap_markers((fdb_snapshot_info_t *)local_578.seqtree,(uint64_t)local_568);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pfStack_590 = (fdb_kvs_handle *)0x10ea8f;
        fdb_close(local_570);
        lVar13 = 0;
        do {
          pfStack_590 = (fdb_kvs_handle *)0x10ea9e;
          fdb_doc_free(local_3c8[lVar13]);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x14);
        pfStack_590 = (fdb_kvs_handle *)0x10eaac;
        fdb_shutdown();
        pfStack_590 = (fdb_kvs_handle *)0x10eab1;
        memleak_end();
        pcVar12 = "single kv mode:";
        if ((char)local_55c != '\0') {
          pcVar12 = "multiple kv mode:";
        }
        pfStack_590 = (fdb_kvs_handle *)0x10eae1;
        sprintf(local_4c8,"compact upto marker in file test %s",pcVar12);
        pcVar12 = "%s PASSED\n";
        if (compact_upto_test(bool)::__test_pass != '\0') {
          pcVar12 = "%s FAILED\n";
        }
        pfStack_590 = (fdb_kvs_handle *)0x10eb0e;
        fprintf(_stderr,pcVar12,local_4c8);
        return;
      }
      goto LAB_0010eb34;
    }
    goto LAB_0010eb39;
  }
  if (local_568 != (fdb_kvs_handle *)0x8) {
    pfStack_590 = (fdb_kvs_handle *)0x10e82c;
    compact_upto_test();
  }
  local_558._8_8_ = ZEXT48(uVar15 + 1);
  doc._M_i = (__int_type_conflict)local_558;
  pcVar23 = (char *)0x0;
  do {
    __s_00 = (code *)((long)pcVar23 * 3);
    aVar9 = local_578;
    if ((fdb_custom_cmp_variable)(&(local_578.seqtree)->root_bid)[(long)pcVar23 * 3] !=
        (fdb_custom_cmp_variable)local_558._8_8_) {
      pfStack_590 = (fdb_kvs_handle *)0x10e911;
      compact_upto_test();
      aVar9 = local_518;
    }
    pfVar8 = (fdb_kvs_handle *)((long)pcVar23 * -5 + 0x14);
    pfVar11 = (fdb_kvs_commit_marker_t *)(&(aVar9.seqtree)->blk_handle)[(long)pcVar23 * 3];
    handle_00 = (fdb_kvs_handle *)0x8;
    pcVar22 = (char *)0x0;
    local_558._16_8_ = pcVar23;
    do {
      if (*(fdb_kvs_handle **)(&(handle_00->kvs_config).create_if_missing + (long)pfVar11) != pfVar8
         ) {
        pfStack_590 = (fdb_kvs_handle *)0x10e8e2;
        compact_upto_test();
      }
      pfStack_590 = (fdb_kvs_handle *)0x10e892;
      sprintf((char *)doc._M_i,"kv%d",(ulong)pcVar22 & 0xffffffff);
      pfVar11 = (fdb_kvs_commit_marker_t *)(&(local_578.seqtree)->blk_handle)[(long)pcVar23 * 3];
      psVar1 = *(short **)((long)&pfVar11[-1].seqnum + (long)handle_00);
      if ((char)psVar1[1] != local_558[2] || *psVar1 != local_558._0_2_) {
        pfStack_590 = (fdb_kvs_handle *)0x10eb2a;
        compact_upto_test();
        goto LAB_0010eb2a;
      }
      pcVar22 = pcVar22 + 1;
      handle_00 = (fdb_kvs_handle *)&(handle_00->kvs_config).custom_cmp_param;
    } while (pcVar12 != pcVar22);
    pcVar23 = (char *)(local_558._16_8_ + 1);
  } while (pcVar23 != pcVar12);
LAB_0010ea07:
  __s_00 = (code *)(local_558 + 0x40);
  pfStack_590 = (fdb_kvs_handle *)0x10ea22;
  sprintf((char *)__s_00,"compact_test_compact%d",1);
  pfStack_590 = (fdb_kvs_handle *)0x10ea38;
  fVar3 = fdb_compact_upto(local_570,(char *)__s_00,
                           (fdb_snapshot_marker_t)(local_578.seqtree)->blk_ops);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eb3e;
  pfStack_590 = (fdb_kvs_handle *)0x10ea5c;
  fVar3 = fdb_snapshot_open((fdb_kvs_handle *)local_558._40_8_,(fdb_kvs_handle **)(local_558 + 0x18)
                            ,(fdb_seqnum_t)(local_578.seqtrie)->btree_blk_ops->blk_read);
  if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0010ea64;
LAB_0010eb43:
  pfStack_590 = (fdb_kvs_handle *)auto_recover_compact_ok_test;
  compact_upto_test();
  pfStack_a78 = (fdb_kvs_handle *)0x10eb65;
  pcStack_5b8 = __s_00;
  pfStack_5b0 = handle_00;
  pfStack_5a8 = (fdb_kvs_handle *)doc._M_i;
  pcStack_5a0 = pcVar12;
  pcStack_598 = pcVar23;
  pfStack_590 = pfVar8;
  gettimeofday((timeval *)(auStack_a28 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_a78 = (fdb_kvs_handle *)0x10eb6a;
  memleak_start();
  pfStack_a78 = (fdb_kvs_handle *)0x10eb76;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_a78 = (fdb_kvs_handle *)0x10eb86;
  fdb_get_default_config();
  pfVar10 = (fdb_kvs_handle *)auStack_a28;
  pfStack_a78 = (fdb_kvs_handle *)0x10eb93;
  fdb_get_default_kvs_config();
  fStack_9b8.buffercache_size = 0x1000000;
  fStack_9b8.wal_threshold = 0x400;
  fStack_9b8.flags = 1;
  fStack_9b8.compaction_threshold = '\0';
  ptr_fhandle_00 = (btree *)&pfStack_a58;
  pfStack_a78 = (fdb_kvs_handle *)0x10ebc5;
  fdb_open((fdb_file_handle **)ptr_fhandle_00,"./compact_test1",&fStack_9b8);
  ppfVar14 = &pfStack_a68;
  pfStack_a78 = (fdb_kvs_handle *)0x10ebd8;
  fdb_kvs_open_default(pfStack_a58,ppfVar14,(fdb_kvs_config *)pfVar10);
  pfStack_a78 = (fdb_kvs_handle *)0x10ebee;
  fVar3 = fdb_set_log_callback(pfStack_a68,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_a78 = (fdb_kvs_handle *)0x10ec12;
    fdb_open((fdb_file_handle **)auStack_a48,"./compact_test1",&fStack_9b8);
    ppfVar14 = &pfStack_a50;
    pfStack_a78 = (fdb_kvs_handle *)0x10ec27;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_a48._0_8_,ppfVar14,(fdb_kvs_config *)auStack_a28);
    pfStack_a78 = (fdb_kvs_handle *)0x10ec3d;
    fVar3 = fdb_set_log_callback(pfStack_a50,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f07d;
    pfStack_a78 = (fdb_kvs_handle *)0x10ec60;
    sprintf(acStack_6c0,"key%d",0);
    pfStack_a78 = (fdb_kvs_handle *)0x10ec7b;
    sprintf(acStack_7c0,"meta%d",0);
    ptr_fhandle_00 = abStack_8c0;
    pfStack_a78 = (fdb_kvs_handle *)0x10ec96;
    sprintf((char *)ptr_fhandle_00,"body%d",0);
    pfStack_a78 = (fdb_kvs_handle *)0x10ec9e;
    sVar5 = strlen(acStack_6c0);
    pfStack_a78 = (fdb_kvs_handle *)0x10eca9;
    sVar6 = strlen(acStack_7c0);
    pfStack_a78 = (fdb_kvs_handle *)0x10ecb4;
    sVar7 = strlen((char *)ptr_fhandle_00);
    pfStack_a78 = (fdb_kvs_handle *)0x10ecd4;
    fdb_doc_create((fdb_doc **)(auStack_a48 + 8),acStack_6c0,sVar5,acStack_7c0,sVar6,ptr_fhandle_00,
                   sVar7);
    pfStack_a78 = (fdb_kvs_handle *)0x10ece2;
    fdb_set(pfStack_a68,(fdb_doc *)auStack_a48._8_8_);
    pfStack_a78 = (fdb_kvs_handle *)0x10ecf8;
    sprintf(acStack_6c0,"key%d",1);
    pfStack_a78 = (fdb_kvs_handle *)0x10ed0e;
    sprintf(acStack_7c0,"meta%d",1);
    pfStack_a78 = (fdb_kvs_handle *)0x10ed24;
    sprintf((char *)ptr_fhandle_00,"body%d",1);
    pfStack_a78 = (fdb_kvs_handle *)0x10ed2c;
    sVar5 = strlen(acStack_6c0);
    pfStack_a78 = (fdb_kvs_handle *)0x10ed37;
    sVar6 = strlen(acStack_7c0);
    pfStack_a78 = (fdb_kvs_handle *)0x10ed42;
    sVar7 = strlen((char *)ptr_fhandle_00);
    pfStack_a78 = (fdb_kvs_handle *)0x10ed5f;
    fdb_doc_create((fdb_doc **)(auStack_a48 + 0x10),acStack_6c0,sVar5,acStack_7c0,sVar6,
                   ptr_fhandle_00,sVar7);
    pfStack_a78 = (fdb_kvs_handle *)0x10ed6e;
    fdb_set(pfStack_a68,(fdb_doc *)auStack_a48._16_8_);
    pfStack_a78 = (fdb_kvs_handle *)0x10ed9a;
    fdb_doc_create((fdb_doc **)&pfStack_a60,
                   *(_func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t **)
                    (auStack_a48._16_8_ + 0x20),
                   (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)auStack_a48._16_8_,
                   *(btree_print_func **)(auStack_a48._16_8_ + 0x38),
                   (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)
                            (auStack_a48._16_8_ + 8),(void *)0x0,0);
    *(bool *)&pfStack_a60->file = true;
    pfStack_a78 = (fdb_kvs_handle *)0x10edac;
    fdb_set(pfStack_a68,(fdb_doc *)pfStack_a60);
    pfStack_a78 = (fdb_kvs_handle *)0x10edb5;
    fdb_doc_free((fdb_doc *)pfStack_a60);
    pfStack_a78 = (fdb_kvs_handle *)0x10edc4;
    fdb_commit(pfStack_a58,'\x01');
    pfStack_a78 = (fdb_kvs_handle *)0x10edd5;
    fdb_compact(pfStack_a58,"./compact_test2");
    pfStack_a78 = (fdb_kvs_handle *)0x10ede1;
    system("cp  compact_test1 compact_test11 > errorlog.txt");
    pfStack_a78 = (fdb_kvs_handle *)0x10edf7;
    sprintf(acStack_6c0,"key%d",2);
    pfStack_a78 = (fdb_kvs_handle *)0x10ee0d;
    sprintf(acStack_7c0,"meta%d",2);
    pfStack_a78 = (fdb_kvs_handle *)0x10ee23;
    sprintf((char *)ptr_fhandle_00,"body%d",2);
    handle_00 = (fdb_kvs_handle *)(auStack_a48 + 0x18);
    pfStack_a78 = (fdb_kvs_handle *)0x10ee30;
    doc._M_i = strlen(acStack_6c0);
    pfStack_a78 = (fdb_kvs_handle *)0x10ee3b;
    pfVar8 = (fdb_kvs_handle *)strlen(acStack_7c0);
    pfStack_a78 = (fdb_kvs_handle *)0x10ee46;
    sVar5 = strlen((char *)ptr_fhandle_00);
    pfStack_a78 = (fdb_kvs_handle *)0x10ee61;
    fdb_doc_create((fdb_doc **)handle_00,acStack_6c0,doc._M_i,acStack_7c0,(size_t)pfVar8,
                   ptr_fhandle_00,sVar5);
    pfStack_a78 = (fdb_kvs_handle *)0x10ee6f;
    fdb_set(pfStack_a68,(fdb_doc *)auStack_a48._24_8_);
    pfStack_a78 = (fdb_kvs_handle *)0x10ee7e;
    fdb_commit(pfStack_a58,'\x01');
    pfStack_a78 = (fdb_kvs_handle *)0x10ee88;
    fdb_kvs_close(pfStack_a68);
    ppfVar14 = &pfStack_a50;
    pfStack_a78 = (fdb_kvs_handle *)0x10ee95;
    fdb_kvs_close(pfStack_a50);
    pfStack_a78 = (fdb_kvs_handle *)0x10ee9f;
    fdb_close(pfStack_a58);
    pfVar10 = (fdb_kvs_handle *)auStack_a48;
    pfStack_a78 = (fdb_kvs_handle *)0x10eeac;
    fdb_close((fdb_file_handle *)auStack_a48._0_8_);
    pfStack_a78 = (fdb_kvs_handle *)0x10eeb8;
    system("mv  compact_test11 compact_test1 > errorlog.txt");
    pfStack_a78 = (fdb_kvs_handle *)0x10eecf;
    fdb_open((fdb_file_handle **)pfVar10,"./compact_test1",&fStack_9b8);
    pfStack_a78 = (fdb_kvs_handle *)0x10eedf;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_a48._0_8_,ppfVar14,(fdb_kvs_config *)auStack_a28);
    pfStack_a78 = (fdb_kvs_handle *)0x10eef5;
    fVar3 = fdb_set_log_callback(pfStack_a50,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      doc._M_i = 0;
      ppfVar14 = &pfStack_a60;
      while( true ) {
        pfStack_a78 = (fdb_kvs_handle *)0x10ef29;
        fdb_doc_create((fdb_doc **)ppfVar14,
                       (void *)(*(size_t **)(auStack_a48 + doc._M_i * 8 + 8))[4],
                       **(size_t **)(auStack_a48 + doc._M_i * 8 + 8),(void *)0x0,0,(void *)0x0,0);
        pfStack_a78 = (fdb_kvs_handle *)0x10ef38;
        fVar3 = fdb_get(pfStack_a50,(fdb_doc *)pfStack_a60);
        pfVar17 = pfStack_a60;
        if ((fdb_kvs_handle *)doc._M_i != (fdb_kvs_handle *)0x1) break;
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010f073;
LAB_0010ef9e:
        pfStack_a78 = (fdb_kvs_handle *)0x10efa6;
        fdb_doc_free((fdb_doc *)pfVar17);
        doc._M_i = (__int_type_conflict)&(((fdb_kvs_handle *)doc._M_i)->kvs_config).field_0x1;
        pfVar10 = pfVar17;
        if ((undefined1 *)doc._M_i == (undefined1 *)0x3) {
          pfStack_a78 = (fdb_kvs_handle *)0x10efc5;
          fdb_get_file_info((fdb_file_handle *)auStack_a48._0_8_,&fStack_a00);
          pfStack_a78 = (fdb_kvs_handle *)0x10efd4;
          iVar4 = strcmp("./compact_test2",fStack_a00.filename);
          if (iVar4 != 0) {
            pfStack_a78 = (fdb_kvs_handle *)0x10efe2;
            auto_recover_compact_ok_test();
          }
          pfStack_a78 = (fdb_kvs_handle *)0x10efec;
          fdb_kvs_close(pfStack_a50);
          pfStack_a78 = (fdb_kvs_handle *)0x10eff6;
          fdb_close((fdb_file_handle *)auStack_a48._0_8_);
          lVar13 = 0;
          do {
            pfStack_a78 = (fdb_kvs_handle *)0x10f002;
            fdb_doc_free(*(fdb_doc **)(auStack_a48 + lVar13 * 8 + 8));
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          pfStack_a78 = (fdb_kvs_handle *)0x10f010;
          fdb_shutdown();
          pfStack_a78 = (fdb_kvs_handle *)0x10f015;
          memleak_end();
          pcVar12 = "%s PASSED\n";
          if (auto_recover_compact_ok_test()::__test_pass != '\0') {
            pcVar12 = "%s FAILED\n";
          }
          pfStack_a78 = (fdb_kvs_handle *)0x10f046;
          fprintf(_stderr,pcVar12,"auto recovery after compaction test");
          return;
        }
      }
      if (fVar3 == FDB_RESULT_SUCCESS) {
        ptr_fhandle_00 = pfStack_a60->staletree;
        pfVar8 = *(fdb_kvs_handle **)(auStack_a48 + doc._M_i * 8 + 8);
        handle_00 = (fdb_kvs_handle *)pfVar8->staletree;
        pfStack_a78 = (fdb_kvs_handle *)0x10ef77;
        iVar4 = bcmp(ptr_fhandle_00,handle_00,(size_t)(pfStack_a60->kvs_config).custom_cmp);
        if (iVar4 == 0) {
          ptr_fhandle_00 = (pfVar17->field_6).seqtree;
          handle_00 = (fdb_kvs_handle *)(pfVar8->field_6).seqtree;
          pfStack_a78 = (fdb_kvs_handle *)0x10ef96;
          iVar4 = bcmp(ptr_fhandle_00,handle_00,(size_t)(pfVar17->kvs_config).custom_cmp_param);
          if (iVar4 == 0) goto LAB_0010ef9e;
          pfStack_a78 = (fdb_kvs_handle *)0x10f063;
          auto_recover_compact_ok_test();
          pfVar10 = pfVar17;
          goto LAB_0010f063;
        }
      }
      else {
LAB_0010f063:
        pfVar17 = pfVar10;
        pfStack_a78 = (fdb_kvs_handle *)0x10f068;
        auto_recover_compact_ok_test();
      }
      pfStack_a78 = (fdb_kvs_handle *)0x10f073;
      auto_recover_compact_ok_test();
      pfVar10 = pfVar17;
LAB_0010f073:
      pfStack_a78 = (fdb_kvs_handle *)0x10f078;
      auto_recover_compact_ok_test();
      goto LAB_0010f078;
    }
  }
  else {
LAB_0010f078:
    pfStack_a78 = (fdb_kvs_handle *)0x10f07d;
    auto_recover_compact_ok_test();
LAB_0010f07d:
    pfStack_a78 = (fdb_kvs_handle *)0x10f082;
    auto_recover_compact_ok_test();
  }
  pfStack_a78 = (fdb_kvs_handle *)unlink_after_compaction_test;
  auto_recover_compact_ok_test();
  pfStack_fe0 = (fdb_kvs_handle *)0x10f0a7;
  ppfStack_aa0 = ppfVar14;
  pfStack_a98 = handle_00;
  pfStack_a90 = (fdb_kvs_handle *)doc._M_i;
  pfStack_a88 = pfVar10;
  pbStack_a80 = ptr_fhandle_00;
  pfStack_a78 = pfVar8;
  gettimeofday(&tStack_f50,(__timezone_ptr_t)0x0);
  pfStack_fe0 = (fdb_kvs_handle *)0x10f0ac;
  memleak_start();
  pfStack_fe0 = (fdb_kvs_handle *)0x10f0b8;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_fe0 = (fdb_kvs_handle *)0x10f0c8;
  fdb_get_default_config();
  pfVar10 = (fdb_kvs_handle *)auStack_f40;
  pfStack_fe0 = (fdb_kvs_handle *)0x10f0d8;
  fdb_get_default_kvs_config();
  fStack_b98.buffercache_size = 0x1000000;
  fStack_b98.wal_threshold = 0x400;
  fStack_b98.flags = 1;
  fStack_b98.compaction_threshold = '\0';
  doc_00 = &pfStack_fb8;
  pfStack_fe0 = (fdb_kvs_handle *)0x10f10a;
  fdb_open((fdb_file_handle **)doc_00,"./compact_test1",&fStack_b98);
  ptr_handle = (list *)(auStack_fc8 + 8);
  pfStack_fe0 = (fdb_kvs_handle *)0x10f11d;
  fdb_kvs_open_default
            ((fdb_file_handle *)pfStack_fb8,(fdb_kvs_handle **)ptr_handle,(fdb_kvs_config *)pfVar10)
  ;
  pfStack_fe0 = (fdb_kvs_handle *)0x10f133;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_fc8._8_8_,logCallbackFunc,
                     "unlink_after_compaction_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    handle_00 = (fdb_kvs_handle *)0x0;
    uVar18 = 0;
    do {
      pfStack_fe0 = (fdb_kvs_handle *)0x10f15b;
      sprintf(acStack_d28,"key%d",uVar18 & 0xffffffff);
      pfStack_fe0 = (fdb_kvs_handle *)0x10f173;
      sprintf(auStack_f40 + 0x118,"meta%d",uVar18 & 0xffffffff);
      pfStack_fe0 = (fdb_kvs_handle *)0x10f18b;
      sprintf(auStack_f40 + 0x18,"body%d",uVar18 & 0xffffffff);
      doc_00 = (fdb_doc **)((long)apfStack_fa8 + (long)handle_00);
      pfStack_fe0 = (fdb_kvs_handle *)0x10f19b;
      doc._M_i = strlen(acStack_d28);
      pfVar8 = (fdb_kvs_handle *)(auStack_f40 + 0x118);
      pfStack_fe0 = (fdb_kvs_handle *)0x10f1ae;
      pfVar10 = (fdb_kvs_handle *)strlen((char *)pfVar8);
      pfStack_fe0 = (fdb_kvs_handle *)0x10f1be;
      sVar5 = strlen(auStack_f40 + 0x18);
      pfStack_fe0 = (fdb_kvs_handle *)0x10f1e3;
      fdb_doc_create(doc_00,acStack_d28,doc._M_i,pfVar8,(size_t)pfVar10,auStack_f40 + 0x18,sVar5);
      pfStack_fe0 = (fdb_kvs_handle *)0x10f1f2;
      fdb_set((fdb_kvs_handle *)auStack_fc8._8_8_,apfStack_fa8[uVar18]);
      uVar18 = uVar18 + 1;
      handle_00 = (fdb_kvs_handle *)((long)handle_00 + 8);
    } while (uVar18 != 10);
    pfStack_fe0 = (fdb_kvs_handle *)0x10f212;
    fdb_commit((fdb_file_handle *)pfStack_fb8,'\x01');
    pfStack_fe0 = (fdb_kvs_handle *)0x10f226;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_fc8._8_8_,&pfStack_fb0,10);
    ptr_handle = (list *)0xa;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f38b;
    pfStack_fe0 = (fdb_kvs_handle *)0x10f23f;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_fb8,"./compact_test2");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfVar10 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_fe0 = (fdb_kvs_handle *)0x10f273;
        fdb_doc_create((fdb_doc **)auStack_fc8,apfStack_fa8[(long)pfVar10]->key,
                       apfStack_fa8[(long)pfVar10]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_fe0 = (fdb_kvs_handle *)0x10f282;
        fVar3 = fdb_get((fdb_kvs_handle *)auStack_fc8._8_8_,(fdb_doc *)auStack_fc8._0_8_);
        if (fVar3 != FDB_RESULT_SUCCESS) {
          pfStack_fe0 = (fdb_kvs_handle *)0x10f381;
          unlink_after_compaction_test();
          goto LAB_0010f381;
        }
        pfStack_fe0 = (fdb_kvs_handle *)0x10f294;
        fdb_doc_free((fdb_doc *)auStack_fc8._0_8_);
        pfVar10 = (fdb_kvs_handle *)&(pfVar10->kvs_config).field_0x1;
      } while (pfVar10 != (fdb_kvs_handle *)0xa);
      pfStack_fe0 = (fdb_kvs_handle *)0x10f2b1;
      iVar4 = stat("./compact_test1",&sStack_c28);
      if (iVar4 == 0) {
        pfStack_fe0 = (fdb_kvs_handle *)0x10f2ba;
        unlink_after_compaction_test();
      }
      pfVar10 = (fdb_kvs_handle *)0x0;
      while( true ) {
        pfStack_fe0 = (fdb_kvs_handle *)0x10f2e6;
        fdb_doc_create((fdb_doc **)auStack_fc8,apfStack_fa8[(long)pfVar10]->key,
                       apfStack_fa8[(long)pfVar10]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_fe0 = (fdb_kvs_handle *)0x10f2f5;
        fVar3 = fdb_get(pfStack_fb0,(fdb_doc *)auStack_fc8._0_8_);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        pfStack_fe0 = (fdb_kvs_handle *)0x10f307;
        fdb_doc_free((fdb_doc *)auStack_fc8._0_8_);
        pfVar10 = (fdb_kvs_handle *)&(pfVar10->kvs_config).field_0x1;
        if (pfVar10 == (fdb_kvs_handle *)0xa) {
          pfStack_fe0 = (fdb_kvs_handle *)0x10f31a;
          fdb_close((fdb_file_handle *)pfStack_fb8);
          pfStack_fe0 = (fdb_kvs_handle *)0x10f31f;
          fdb_shutdown();
          lVar13 = 0;
          do {
            pfStack_fe0 = (fdb_kvs_handle *)0x10f32b;
            fdb_doc_free(apfStack_fa8[lVar13]);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 10);
          pfStack_fe0 = (fdb_kvs_handle *)0x10f339;
          memleak_end();
          pcVar12 = "%s PASSED\n";
          if (unlink_after_compaction_test()::__test_pass != '\0') {
            pcVar12 = "%s FAILED\n";
          }
          pfStack_fe0 = (fdb_kvs_handle *)0x10f36a;
          fprintf(_stderr,pcVar12,"unlink after compaction test");
          return;
        }
      }
LAB_0010f381:
      ptr_handle = (list *)auStack_fc8;
      pfStack_fe0 = (fdb_kvs_handle *)0x10f386;
      unlink_after_compaction_test();
      goto LAB_0010f386;
    }
  }
  else {
LAB_0010f386:
    pfStack_fe0 = (fdb_kvs_handle *)0x10f38b;
    unlink_after_compaction_test();
LAB_0010f38b:
    pfStack_fe0 = (fdb_kvs_handle *)0x10f390;
    unlink_after_compaction_test();
  }
  pfStack_fe0 = (fdb_kvs_handle *)db_compact_overwrite;
  unlink_after_compaction_test();
  pfStack_1788 = (fdb_kvs_handle *)0x10f3b5;
  fStack_11f0.bub_ctx.entries = ptr_handle;
  fStack_11f0.bub_ctx.num_entries = (uint64_t)handle_00;
  fStack_11f0.bub_ctx.space_used = doc._M_i;
  fStack_11f0.bub_ctx.handle = pfVar10;
  ppfStack_fe8 = doc_00;
  pfStack_fe0 = pfVar8;
  gettimeofday(&tStack_16f0,(__timezone_ptr_t)0x0);
  pfStack_1788 = (fdb_kvs_handle *)0x10f3ba;
  memleak_start();
  pfStack_1788 = (fdb_kvs_handle *)0x10f3c6;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_1788 = (fdb_kvs_handle *)0x10f3d6;
  fdb_get_default_config();
  kvs_config_00 = &fStack_1738;
  pfStack_1788 = (fdb_kvs_handle *)0x10f3e3;
  fdb_get_default_kvs_config();
  auStack_15e0._256_8_ = 0x1000000;
  auStack_15e0._264_8_ = 0x400;
  auStack_15e0._284_4_ = 1;
  auStack_15e0[0x127] = 0;
  pfVar10 = (fdb_kvs_handle *)(auStack_1760 + 0x18);
  pfStack_1788 = (fdb_kvs_handle *)0x10f415;
  fdb_open((fdb_file_handle **)pfVar10,"./compact_test1",(fdb_config *)(auStack_15e0 + 0xf8));
  ppfVar14 = (fdb_kvs_handle **)(auStack_1760 + 8);
  pfStack_1788 = (fdb_kvs_handle *)0x10f42a;
  fdb_kvs_open((fdb_file_handle *)auStack_1760._24_8_,ppfVar14,(char *)0x0,kvs_config_00);
  pfStack_1788 = (fdb_kvs_handle *)0x10f440;
  pfVar17 = (fdb_kvs_handle *)auStack_1760._8_8_;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1760._8_8_,logCallbackFunc,"db_destroy_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    handle_00 = (fdb_kvs_handle *)0x0;
    uVar18 = 0;
    do {
      pfStack_1788 = (fdb_kvs_handle *)0x10f468;
      sprintf(acStack_12f0,"key%d",uVar18 & 0xffffffff);
      pfStack_1788 = (fdb_kvs_handle *)0x10f480;
      sprintf(auStack_15e0 + 0x1f0,"meta%d",uVar18 & 0xffffffff);
      pfStack_1788 = (fdb_kvs_handle *)0x10f498;
      sprintf(acStack_16e0,"body%d",uVar18 & 0xffffffff);
      pfVar10 = (fdb_kvs_handle *)(auStack_15e0 + (long)handle_00);
      pfStack_1788 = (fdb_kvs_handle *)0x10f4ab;
      doc._M_i = strlen(acStack_12f0);
      pfVar8 = (fdb_kvs_handle *)(auStack_15e0 + 0x1f0);
      pfStack_1788 = (fdb_kvs_handle *)0x10f4be;
      kvs_config_00 = (fdb_kvs_config *)strlen((char *)pfVar8);
      pfStack_1788 = (fdb_kvs_handle *)0x10f4ce;
      sVar5 = strlen(acStack_16e0);
      pfStack_1788 = (fdb_kvs_handle *)0x10f4f3;
      fdb_doc_create((fdb_doc **)pfVar10,acStack_12f0,doc._M_i,pfVar8,(size_t)kvs_config_00,
                     acStack_16e0,sVar5);
      pfStack_1788 = (fdb_kvs_handle *)0x10f505;
      fdb_set((fdb_kvs_handle *)auStack_1760._8_8_,*(fdb_doc **)(auStack_15e0 + uVar18 * 8));
      uVar18 = uVar18 + 1;
      handle_00 = (fdb_kvs_handle *)((long)handle_00 + 8);
    } while (uVar18 != 0x1e);
    pfStack_1788 = (fdb_kvs_handle *)0x10f522;
    fdb_commit((fdb_file_handle *)auStack_1760._24_8_,'\0');
    pfStack_1788 = (fdb_kvs_handle *)0x10f53e;
    fdb_open((fdb_file_handle **)(auStack_1760 + 0x10),"./compact_test1.1",
             (fdb_config *)(auStack_15e0 + 0xf8));
    ppfVar14 = (fdb_kvs_handle **)auStack_1770;
    pfStack_1788 = (fdb_kvs_handle *)0x10f555;
    fdb_kvs_open((fdb_file_handle *)auStack_1760._16_8_,ppfVar14,(char *)0x0,&fStack_1738);
    pfStack_1788 = (fdb_kvs_handle *)0x10f56b;
    pfVar17 = (fdb_kvs_handle *)auStack_1770._0_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_1770._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f9da;
    handle_00 = (fdb_kvs_handle *)0x0;
    uVar18 = 0;
    do {
      pfStack_1788 = (fdb_kvs_handle *)0x10f593;
      sprintf(acStack_12f0,"k2ey%d",uVar18 & 0xffffffff);
      pfStack_1788 = (fdb_kvs_handle *)0x10f5ab;
      sprintf(auStack_15e0 + 0x1f0,"m2eta%d",uVar18 & 0xffffffff);
      pfStack_1788 = (fdb_kvs_handle *)0x10f5c3;
      sprintf(acStack_16e0,"b2ody%d",uVar18 & 0xffffffff);
      pfVar10 = (fdb_kvs_handle *)(&fStack_11f0.kvs_config.create_if_missing + (long)handle_00);
      pfStack_1788 = (fdb_kvs_handle *)0x10f5d6;
      doc._M_i = strlen(acStack_12f0);
      pfVar8 = (fdb_kvs_handle *)(auStack_15e0 + 0x1f0);
      pfStack_1788 = (fdb_kvs_handle *)0x10f5e9;
      kvs_config_00 = (fdb_kvs_config *)strlen((char *)pfVar8);
      pfStack_1788 = (fdb_kvs_handle *)0x10f5f9;
      sVar5 = strlen(acStack_16e0);
      pfStack_1788 = (fdb_kvs_handle *)0x10f61e;
      fdb_doc_create((fdb_doc **)pfVar10,acStack_12f0,doc._M_i,pfVar8,(size_t)kvs_config_00,
                     acStack_16e0,sVar5);
      pfStack_1788 = (fdb_kvs_handle *)0x10f630;
      fdb_set((fdb_kvs_handle *)auStack_1770._0_8_,
              *(fdb_doc **)(&fStack_11f0.kvs_config.create_if_missing + uVar18 * 8));
      uVar18 = uVar18 + 1;
      handle_00 = (fdb_kvs_handle *)((long)handle_00 + 8);
    } while (uVar18 != 0x3c);
    pfStack_1788 = (fdb_kvs_handle *)0x10f64d;
    fdb_commit((fdb_file_handle *)auStack_1760._16_8_,'\0');
    pfStack_1788 = (fdb_kvs_handle *)0x10f65c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1770._0_8_,&fStack_1720);
    if ((filemgr *)fStack_1720.last_seqnum != (filemgr *)0x3c) {
      pfStack_1788 = (fdb_kvs_handle *)0x10f66c;
      db_compact_overwrite();
    }
    pfStack_1788 = (fdb_kvs_handle *)0x10f676;
    fdb_kvs_close((fdb_kvs_handle *)auStack_1770._0_8_);
    pfStack_1788 = (fdb_kvs_handle *)0x10f680;
    fdb_close((fdb_file_handle *)auStack_1760._16_8_);
    pfStack_1788 = (fdb_kvs_handle *)0x10f68c;
    pfVar17 = (fdb_kvs_handle *)auStack_1760._24_8_;
    fVar3 = fdb_compact((fdb_file_handle *)auStack_1760._24_8_,(char *)0x0);
    ppfVar14 = (fdb_kvs_handle **)0x3c;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f9df;
    kvs_config_00 = (fdb_kvs_config *)(auStack_1760 + 8);
    pfStack_1788 = (fdb_kvs_handle *)0x10f6a1;
    fdb_kvs_close((fdb_kvs_handle *)auStack_1760._8_8_);
    pfVar10 = (fdb_kvs_handle *)(auStack_1760 + 0x18);
    pfStack_1788 = (fdb_kvs_handle *)0x10f6ae;
    fdb_close((fdb_file_handle *)auStack_1760._24_8_);
    pfStack_1788 = (fdb_kvs_handle *)0x10f6c5;
    fdb_open((fdb_file_handle **)pfVar10,"./compact_test1",(fdb_config *)(auStack_15e0 + 0xf8));
    pfStack_1788 = (fdb_kvs_handle *)0x10f6d7;
    fdb_kvs_open((fdb_file_handle *)auStack_1760._24_8_,(fdb_kvs_handle **)kvs_config_00,(char *)0x0
                 ,&fStack_1738);
    pfStack_1788 = (fdb_kvs_handle *)0x10f6ed;
    pfVar17 = (fdb_kvs_handle *)auStack_1760._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_1760._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f9e4;
    ppfVar14 = (fdb_kvs_handle **)0x0;
    kvs_config_00 = (fdb_kvs_config *)(auStack_1770 + 8);
    pfVar10 = (fdb_kvs_handle *)auStack_1760;
    do {
      pfStack_1788 = (fdb_kvs_handle *)0x10f728;
      fdb_doc_create((fdb_doc **)kvs_config_00,
                     (void *)(*(size_t **)(auStack_15e0 + (long)ppfVar14))[4],
                     **(size_t **)(auStack_15e0 + (long)ppfVar14),(void *)0x0,0,(void *)0x0,0);
      pfStack_1788 = (fdb_kvs_handle *)0x10f737;
      pfVar17 = (fdb_kvs_handle *)auStack_1760._8_8_;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_1760._8_8_,(fdb_doc *)auStack_1770._8_8_);
      pfVar16 = (fdb_kvs_handle *)auStack_1770._8_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1788 = (fdb_kvs_handle *)0x10f9d0;
        db_compact_overwrite();
        goto LAB_0010f9d0;
      }
      doc._M_i = (__int_type_conflict)(auStack_15e0 + (long)ppfVar14);
      handle_00 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)doc._M_i)->kvs_config;
      pfStack_1788 = (fdb_kvs_handle *)0x10f765;
      iVar4 = bcmp(*(btree **)(auStack_1770._8_8_ + 0x38),handle_00->staletree,
                   (size_t)((fdb_kvs_config *)auStack_1770._8_8_)->custom_cmp);
      if (iVar4 != 0) {
        pfStack_1788 = (fdb_kvs_handle *)0x10f7ad;
        db_compact_overwrite();
        pfVar16 = pfStack_1740;
        handle_00 = (fdb_kvs_handle *)auStack_1760._0_8_;
      }
      pfStack_1788 = (fdb_kvs_handle *)0x10f77b;
      iVar4 = bcmp((pfVar16->field_6).seqtree,(handle_00->field_6).seqtree,
                   (size_t)(pfVar16->kvs_config).custom_cmp_param);
      pfVar8 = pfVar16;
      if (iVar4 != 0) {
        pfStack_1788 = (fdb_kvs_handle *)0x10f7c7;
        db_compact_overwrite();
        pfVar8 = (fdb_kvs_handle *)auStack_1760._0_8_;
      }
      pfStack_1788 = (fdb_kvs_handle *)0x10f787;
      fdb_doc_free((fdb_doc *)pfVar8);
      ppfVar14 = ppfVar14 + 1;
    } while (ppfVar14 != (fdb_kvs_handle **)0xf0);
    pfStack_1788 = (fdb_kvs_handle *)0x10f7ea;
    fdb_open((fdb_file_handle **)(auStack_1760 + 0x10),"./compact_test1.1",
             (fdb_config *)(auStack_15e0 + 0xf8));
    kvs_config_00 = (fdb_kvs_config *)auStack_1770;
    pfStack_1788 = (fdb_kvs_handle *)0x10f801;
    fdb_kvs_open((fdb_file_handle *)auStack_1760._16_8_,(fdb_kvs_handle **)kvs_config_00,(char *)0x0
                 ,&fStack_1738);
    pfStack_1788 = (fdb_kvs_handle *)0x10f817;
    pfVar17 = (fdb_kvs_handle *)auStack_1770._0_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_1770._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_1788 = (fdb_kvs_handle *)0x10f831;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_1770._0_8_,&fStack_1720);
      if ((filemgr *)fStack_1720.last_seqnum != (filemgr *)0x3c) {
        pfStack_1788 = (fdb_kvs_handle *)0x10f842;
        db_compact_overwrite();
      }
      pfVar8 = (fdb_kvs_handle *)0x0;
      ppfVar14 = (fdb_kvs_handle **)(auStack_1770 + 8);
      kvs_config_00 = (fdb_kvs_config *)auStack_1760;
      while( true ) {
        psVar2 = *(size_t **)
                  (&fStack_11f0.kvs_config.create_if_missing +
                  (long)&(pfVar8->kvs_config).create_if_missing);
        pfStack_1788 = (fdb_kvs_handle *)0x10f875;
        fdb_doc_create((fdb_doc **)ppfVar14,(void *)psVar2[4],*psVar2,(void *)0x0,0,(void *)0x0,0);
        pfStack_1788 = (fdb_kvs_handle *)0x10f884;
        pfVar17 = (fdb_kvs_handle *)auStack_1770._0_8_;
        fVar3 = fdb_get((fdb_kvs_handle *)auStack_1770._0_8_,(fdb_doc *)auStack_1770._8_8_);
        pfVar16 = (fdb_kvs_handle *)auStack_1770._8_8_;
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        handle_00 = (fdb_kvs_handle *)
                    (&fStack_11f0.kvs_config.create_if_missing +
                    (long)&(pfVar8->kvs_config).create_if_missing);
        pfVar10 = *(fdb_kvs_handle **)&handle_00->kvs_config;
        pfStack_1788 = (fdb_kvs_handle *)0x10f8b1;
        iVar4 = bcmp(*(btree **)(auStack_1770._8_8_ + 0x38),pfVar10->staletree,
                     (size_t)((fdb_kvs_config *)auStack_1770._8_8_)->custom_cmp);
        if (iVar4 != 0) {
          pfStack_1788 = (fdb_kvs_handle *)0x10f8f8;
          db_compact_overwrite();
          pfVar16 = pfStack_1740;
          pfVar10 = (fdb_kvs_handle *)auStack_1760._0_8_;
        }
        pfStack_1788 = (fdb_kvs_handle *)0x10f8c6;
        iVar4 = bcmp((pfVar16->field_6).seqtree,(pfVar10->field_6).seqtree,
                     (size_t)(pfVar16->kvs_config).custom_cmp_param);
        doc._M_i = (__int_type_conflict)pfVar16;
        if (iVar4 != 0) {
          pfStack_1788 = (fdb_kvs_handle *)0x10f912;
          db_compact_overwrite();
          doc._M_i = auStack_1760._0_8_;
        }
        pfStack_1788 = (fdb_kvs_handle *)0x10f8d2;
        fdb_doc_free((fdb_doc *)doc._M_i);
        pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).custom_cmp;
        if (pfVar8 == (fdb_kvs_handle *)0x1e0) {
          lVar13 = 0;
          do {
            pfStack_1788 = (fdb_kvs_handle *)0x10f928;
            fdb_doc_free(*(fdb_doc **)(auStack_15e0 + lVar13 * 8));
            pfStack_1788 = (fdb_kvs_handle *)0x10f935;
            fdb_doc_free(*(fdb_doc **)(&fStack_11f0.kvs_config.create_if_missing + lVar13 * 8));
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x1e);
          lVar13 = 0;
          do {
            pfStack_1788 = (fdb_kvs_handle *)0x10f94d;
            fdb_doc_free(*(fdb_doc **)(fStack_11f0.config.encryption_key.bytes + lVar13 * 8 + -0x14)
                        );
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x1e);
          pfStack_1788 = (fdb_kvs_handle *)0x10f960;
          fdb_kvs_close((fdb_kvs_handle *)auStack_1760._8_8_);
          pfStack_1788 = (fdb_kvs_handle *)0x10f96a;
          fdb_close((fdb_file_handle *)auStack_1760._24_8_);
          pfStack_1788 = (fdb_kvs_handle *)0x10f974;
          fdb_kvs_close((fdb_kvs_handle *)auStack_1770._0_8_);
          pfStack_1788 = (fdb_kvs_handle *)0x10f97e;
          fdb_close((fdb_file_handle *)auStack_1760._16_8_);
          pfStack_1788 = (fdb_kvs_handle *)0x10f983;
          fdb_shutdown();
          pfStack_1788 = (fdb_kvs_handle *)0x10f988;
          memleak_end();
          pcVar12 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar12 = "%s FAILED\n";
          }
          pfStack_1788 = (fdb_kvs_handle *)0x10f9b9;
          fprintf(_stderr,pcVar12,"compact overwrite");
          return;
        }
      }
LAB_0010f9d0:
      pfStack_1788 = (fdb_kvs_handle *)0x10f9d5;
      db_compact_overwrite();
      goto LAB_0010f9d5;
    }
  }
  else {
LAB_0010f9d5:
    pfStack_1788 = (fdb_kvs_handle *)0x10f9da;
    db_compact_overwrite();
LAB_0010f9da:
    pfStack_1788 = (fdb_kvs_handle *)0x10f9df;
    db_compact_overwrite();
LAB_0010f9df:
    pfStack_1788 = (fdb_kvs_handle *)0x10f9e4;
    db_compact_overwrite();
LAB_0010f9e4:
    pfStack_1788 = (fdb_kvs_handle *)0x10f9e9;
    db_compact_overwrite();
  }
  pfStack_1788 = (fdb_kvs_handle *)db_compact_during_doc_delete;
  db_compact_overwrite();
  ppfStack_17b0 = ppfVar14;
  pfStack_17a8 = handle_00;
  pfStack_17a0 = (fdb_kvs_handle *)doc._M_i;
  pfStack_1798 = kvs_config_00;
  pfStack_1790 = pfVar10;
  pfStack_1788 = pfVar8;
  gettimeofday(&tStack_1ee0,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStack_1ed0.buffercache_size = 0;
  fStack_1ed0.wal_threshold = 0x400;
  fStack_1ed0.compaction_threshold = '\0';
  if (pfVar17 == (fdb_kvs_handle *)0x0) {
    system("rm -rf  compact_test* > errorlog.txt");
    _Var19._M_i = (__int_type_conflict)&pfStack_1f48;
    fVar3 = fdb_open((fdb_file_handle **)_Var19._M_i,"./compact_test1",&fStack_1ed0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      _Var19._M_i = (__int_type_conflict)pfStack_1f48;
      fVar3 = fdb_kvs_open_default((fdb_file_handle *)pfStack_1f48,&pfStack_1f40,&fStack_1f28);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fd42;
      lVar13 = 0;
      uVar18 = 0;
      do {
        __s = &afStack_1cd8[0].config.encryption_key;
        sprintf((char *)__s,"key%d",uVar18 & 0xffffffff);
        sprintf((char *)afStack_1cd8,"meta%d",uVar18 & 0xffffffff);
        sprintf(acStack_1dd8,"body%d",uVar18 & 0xffffffff);
        doc._M_i = strlen((char *)__s);
        pfVar8 = afStack_1cd8;
        sVar5 = strlen((char *)pfVar8);
        sVar6 = strlen(acStack_1dd8);
        fdb_doc_create((fdb_doc **)((long)&afStack_1cd8[0].bub_ctx.handle + lVar13),
                       &afStack_1cd8[0].config.encryption_key,doc._M_i,pfVar8,sVar5,acStack_1dd8,
                       sVar6);
        fdb_set(pfStack_1f40,(fdb_doc *)(&afStack_1cd8[0].bub_ctx.handle)[uVar18]);
        uVar18 = uVar18 + 1;
        lVar13 = lVar13 + 8;
      } while (uVar18 != 100);
      fdb_commit((fdb_file_handle *)pfStack_1f48,'\0');
      fdb_get_kvs_info(pfStack_1f40,&fStack_1f10);
      if ((filemgr *)fStack_1f10.doc_count != (filemgr *)0x64) {
        db_compact_during_doc_delete();
      }
      lVar13 = 0;
      pfVar10 = (fdb_kvs_handle *)&plStack_1f38;
      do {
        fdb_del(pfStack_1f40,(fdb_doc *)(&afStack_1cd8[0].bub_ctx.handle)[lVar13]);
        if (lVar13 == 0x32) {
          pthread_create((pthread_t *)pfVar10,(pthread_attr_t *)0x0,db_compact_during_doc_delete,
                         pfStack_1f48);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 100);
      pthread_join((pthread_t)plStack_1f38,&pvStack_1f30);
      fdb_commit((fdb_file_handle *)pfStack_1f48,'\x01');
      fdb_get_kvs_info(pfStack_1f40,&fStack_1f10);
      if ((filemgr *)fStack_1f10.doc_count != (filemgr *)0x0) {
        db_compact_during_doc_delete();
      }
      fdb_kvs_close(pfStack_1f40);
      _Var19._M_i = (__int_type_conflict)&pfStack_1f48;
      fdb_close((fdb_file_handle *)pfStack_1f48);
      fVar3 = fdb_open((fdb_file_handle **)_Var19._M_i,"./compact_test1",&fStack_1ed0);
      handle_00 = (fdb_kvs_handle *)0x64;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fd47;
      _Var19._M_i = (__int_type_conflict)pfStack_1f48;
      fVar3 = fdb_kvs_open_default((fdb_file_handle *)pfStack_1f48,&pfStack_1f40,&fStack_1f28);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        fdb_get_kvs_info(pfStack_1f40,&fStack_1f10);
        if ((filemgr *)fStack_1f10.doc_count != (filemgr *)0x0) {
          db_compact_during_doc_delete();
        }
        lVar13 = 0;
        do {
          fdb_doc_free((fdb_doc *)(&afStack_1cd8[0].bub_ctx.handle)[lVar13]);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 100);
        fdb_kvs_close(pfStack_1f40);
        fdb_close((fdb_file_handle *)pfStack_1f48);
        fdb_shutdown();
        memleak_end();
        pcVar12 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar12 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar12,"multi thread client shutdown");
        return;
      }
    }
    else {
      db_compact_during_doc_delete();
LAB_0010fd42:
      db_compact_during_doc_delete();
LAB_0010fd47:
      db_compact_during_doc_delete();
    }
    db_compact_during_doc_delete();
LAB_0010fd51:
    db_compact_during_doc_delete();
  }
  else {
    _Var19._M_i = (__int_type_conflict)&pfStack_1f48;
    fVar3 = fdb_open((fdb_file_handle **)_Var19._M_i,"./compact_test1",&fStack_1ed0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fd51;
    _Var19._M_i = (__int_type_conflict)pfStack_1f48;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_1f48,(char *)0x0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fdb_close((fdb_file_handle *)pfStack_1f48);
      pthread_exit((void *)0x0);
    }
  }
  db_compact_during_doc_delete();
  ptr_fhandle = (filemgr *)0x0;
  pfStack_15d08 = (fdb_kvs_handle *)0x10fd83;
  auStack_15cd0._8_8_ = _Var19._M_i;
  gettimeofday(&tStack_15b68,(__timezone_ptr_t)0x0);
  pfStack_15d08 = (fdb_kvs_handle *)0x10fd88;
  memleak_start();
  pfStack_15d08 = (fdb_kvs_handle *)0x10fd94;
  system("rm -rf  compact_test* > errorlog.txt");
  pcVar12 = auStack_15c70;
  pfStack_15d08 = (fdb_kvs_handle *)0x10fda4;
  fdb_get_default_config();
  pfStack_15d08 = (fdb_kvs_handle *)0x10fdae;
  fdb_get_default_kvs_config();
  auStack_15c70._8_8_ = 0;
  aStack_15c60.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x400;
  fStack_15c4c = 1;
  uStack_15c42 = 0x1e01;
  pfStack_15c38 = (filemgr *)0x1;
  aStack_15bf8.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  pcVar22 = auStack_15cf8;
  pfStack_15d08 = (fdb_kvs_handle *)0x10fde7;
  fVar3 = fdb_open((fdb_file_handle **)pcVar22,"compact_test",(fdb_config *)pcVar12);
  if (fVar3 == FDB_RESULT_INVALID_CONFIG) {
    aStack_15bf8.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)4;
    pfStack_15d08 = (fdb_kvs_handle *)0x10fe14;
    fdb_open((fdb_file_handle **)auStack_15cf8,"compact_test",(fdb_config *)auStack_15c70);
    pcVar12 = auStack_15cf0;
    pfStack_15d08 = (fdb_kvs_handle *)0x10fe29;
    fdb_kvs_open_default((fdb_file_handle *)auStack_15cf8,(fdb_kvs_handle **)pcVar12,&fStack_15cc0);
    pfStack_15d08 = (fdb_kvs_handle *)0x10fe3f;
    pcVar22 = (char *)auStack_15cf0;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_15cf0,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108c8;
    pfStack_15d08 = (fdb_kvs_handle *)0x10fe53;
    puts("Initialize..");
    doc._M_i = 0;
    uVar18 = 0;
    do {
      pfStack_15d08 = (fdb_kvs_handle *)0x10fe75;
      sprintf(auStack_15b58 + 0x48,"key%04d",uVar18 & 0xffffffff);
      pfStack_15d08 = (fdb_kvs_handle *)0x10fe8e;
      sprintf(acStack_15910,"meta%04d",uVar18 & 0xffffffff);
      pfStack_15d08 = (fdb_kvs_handle *)0x10fea7;
      sprintf(acStack_15a10,"body%04d",uVar18 & 0xffffffff);
      handle_00 = (fdb_kvs_handle *)(&afStack_15810[0].kvs_config.create_if_missing + doc._M_i);
      pfStack_15d08 = (fdb_kvs_handle *)0x10feba;
      sVar5 = strlen(auStack_15b58 + 0x48);
      pfVar8 = (fdb_kvs_handle *)(sVar5 + 1);
      pfStack_15d08 = (fdb_kvs_handle *)0x10fece;
      sVar5 = strlen(acStack_15910);
      pfVar10 = (fdb_kvs_handle *)(sVar5 + 1);
      pfStack_15d08 = (fdb_kvs_handle *)0x10fedf;
      sVar5 = strlen(acStack_15a10);
      pfStack_15d08 = (fdb_kvs_handle *)0x10ff07;
      fdb_doc_create((fdb_doc **)handle_00,auStack_15b58 + 0x48,(size_t)pfVar8,acStack_15910,
                     (size_t)pfVar10,acStack_15a10,sVar5 + 1);
      pfStack_15d08 = (fdb_kvs_handle *)0x10ff19;
      fdb_set((fdb_kvs_handle *)auStack_15cf0,
              *(fdb_doc **)(&afStack_15810[0].kvs_config.create_if_missing + uVar18 * 8));
      uVar18 = uVar18 + 1;
      doc._M_i = doc._M_i + 8;
    } while (uVar18 != 10000);
    pcVar12 = auStack_15cf8;
    pfStack_15d08 = (fdb_kvs_handle *)0x10ff3c;
    fdb_commit((fdb_file_handle *)auStack_15cf8,'\0');
    pfStack_15d08 = (fdb_kvs_handle *)0x10ff44;
    fdb_close((fdb_file_handle *)auStack_15cf8);
    pfStack_15d08 = (fdb_kvs_handle *)0x10ff5b;
    pcVar22 = pcVar12;
    fVar3 = fdb_open((fdb_file_handle **)pcVar12,"compact_test",(fdb_config *)auStack_15c70);
    ptr_fhandle = (filemgr *)0x2710;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108cd;
    pfStack_15d08 = (fdb_kvs_handle *)0x10ff77;
    pcVar22 = (char *)auStack_15cf8;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_15cf8,(fdb_kvs_handle **)auStack_15cf0,
                       &fStack_15cc0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108d2;
    pfStack_15d08 = (fdb_kvs_handle *)0x10ff97;
    pcVar22 = (char *)auStack_15cf0;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_15cf0,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108d7;
    pcVar12 = auStack_15b58;
    pfStack_15d08 = (fdb_kvs_handle *)0x10ffb4;
    fdb_get_file_info((fdb_file_handle *)auStack_15cf8,(fdb_file_info *)pcVar12);
    pfStack_15d08 = (fdb_kvs_handle *)0x10ffc3;
    iVar4 = strcmp((char *)auStack_15b58._0_8_,"compact_test");
    if (iVar4 != 0) {
      pfStack_15d08 = (fdb_kvs_handle *)0x10ffd4;
      compaction_daemon_test();
    }
    ptr_fhandle = (filemgr *)(auStack_15b58 + 0x48);
    pfVar10 = (fdb_kvs_handle *)auStack_15ce0;
    handle_00 = (fdb_kvs_handle *)0x0;
    _Var19._M_i = doc._M_i;
    do {
      pfStack_15d08 = (fdb_kvs_handle *)0x10fff8;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)handle_00 & 0xffffffff);
      pfStack_15d08 = (fdb_kvs_handle *)0x110000;
      sVar5 = strlen((char *)ptr_fhandle);
      pfStack_15d08 = (fdb_kvs_handle *)0x11001f;
      fdb_doc_create((fdb_doc **)pfVar10,ptr_fhandle,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_15d08 = (fdb_kvs_handle *)0x11002e;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_15cf0,(fdb_doc *)auStack_15ce0._0_8_);
      doc._M_i = auStack_15ce0._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_0011089e:
        pfStack_15d08 = (fdb_kvs_handle *)0x1108a3;
        compaction_daemon_test();
        goto LAB_001108a3;
      }
      pfVar8 = (fdb_kvs_handle *)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_15ce0._0_8_ + 0x40))->
               seqtree;
      pcVar12 = *(char **)(*(long *)(&afStack_15810[0].kvs_config.create_if_missing +
                                    (long)handle_00 * 8) + 0x40);
      pfStack_15d08 = (fdb_kvs_handle *)0x11005a;
      iVar4 = bcmp(pfVar8,pcVar12,(size_t)*(void **)(auStack_15ce0._0_8_ + 0x10));
      _Var19._M_i = doc._M_i;
      if (iVar4 != 0) {
        pfStack_15d08 = (fdb_kvs_handle *)0x11089e;
        compaction_daemon_test();
        goto LAB_0011089e;
      }
      pfStack_15d08 = (fdb_kvs_handle *)0x11006a;
      fdb_doc_free((fdb_doc *)doc._M_i);
      handle_00 = (fdb_kvs_handle *)&(handle_00->kvs_config).field_0x1;
    } while (handle_00 != (fdb_kvs_handle *)0x2710);
    pfStack_15d08 = (fdb_kvs_handle *)0x11008e;
    pcVar22 = (char *)auStack_15cf0;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_15cf0,(fdb_kvs_handle **)&aStack_15ca8,10000
                             );
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108dc;
    pfStack_15d08 = (fdb_kvs_handle *)0x1100a0;
    fdb_kvs_close((fdb_kvs_handle *)aStack_15ca8.super___atomic_base<unsigned_long>._M_i);
    pcVar12 = auStack_15cf8;
    pfStack_15d08 = (fdb_kvs_handle *)0x1100ad;
    fdb_close((fdb_file_handle *)auStack_15cf8);
    pfStack_15d08 = (fdb_kvs_handle *)0x1100b9;
    system("rm -rf  compact_test.meta > errorlog.txt");
    pfStack_15d08 = (fdb_kvs_handle *)0x1100d0;
    pcVar22 = pcVar12;
    fVar3 = fdb_open((fdb_file_handle **)pcVar12,"compact_test",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108e1;
    pfStack_15d08 = (fdb_kvs_handle *)0x1100ec;
    pcVar22 = (char *)auStack_15cf8;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_15cf8,(fdb_kvs_handle **)auStack_15cf0,
                       &fStack_15cc0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108e6;
    pfStack_15d08 = (fdb_kvs_handle *)0x11010c;
    pcVar22 = (char *)auStack_15cf0;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_15cf0,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108eb;
    ptr_fhandle = (filemgr *)(auStack_15b58 + 0x48);
    pfVar10 = (fdb_kvs_handle *)auStack_15ce0;
    handle_00 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_15d08 = (fdb_kvs_handle *)0x110138;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)handle_00 & 0xffffffff);
      pfStack_15d08 = (fdb_kvs_handle *)0x110140;
      sVar5 = strlen((char *)ptr_fhandle);
      pfStack_15d08 = (fdb_kvs_handle *)0x11015f;
      fdb_doc_create((fdb_doc **)pfVar10,ptr_fhandle,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_15d08 = (fdb_kvs_handle *)0x11016e;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_15cf0,(fdb_doc *)auStack_15ce0._0_8_);
      _Var19._M_i = auStack_15ce0._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108ae;
      pfVar8 = (fdb_kvs_handle *)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_15ce0._0_8_ + 0x40))->
               seqtree;
      pcVar12 = *(char **)(*(long *)(&afStack_15810[0].kvs_config.create_if_missing +
                                    (long)handle_00 * 8) + 0x40);
      pfStack_15d08 = (fdb_kvs_handle *)0x11019a;
      iVar4 = bcmp(pfVar8,pcVar12,(size_t)*(void **)(auStack_15ce0._0_8_ + 0x10));
      if (iVar4 != 0) goto LAB_001108a3;
      pfStack_15d08 = (fdb_kvs_handle *)0x1101aa;
      fdb_doc_free((fdb_doc *)_Var19._M_i);
      handle_00 = (fdb_kvs_handle *)&(handle_00->kvs_config).field_0x1;
      doc._M_i = _Var19._M_i;
    } while (handle_00 != (fdb_kvs_handle *)0x2710);
    pcVar12 = auStack_15cf8;
    pfStack_15d08 = (fdb_kvs_handle *)0x1101c7;
    fdb_close((fdb_file_handle *)auStack_15cf8);
    pfStack_15d08 = (fdb_kvs_handle *)0x1101d3;
    system("mv  compact_test.0 compact_test.23 > errorlog.txt");
    pfStack_15d08 = (fdb_kvs_handle *)0x1101ea;
    pcVar22 = pcVar12;
    fVar3 = fdb_open((fdb_file_handle **)pcVar12,"compact_test",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108f0;
    pfStack_15d08 = (fdb_kvs_handle *)0x110206;
    pcVar22 = (char *)auStack_15cf8;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_15cf8,(fdb_kvs_handle **)auStack_15cf0,
                       &fStack_15cc0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108f5;
    pfStack_15d08 = (fdb_kvs_handle *)0x110226;
    pcVar22 = (char *)auStack_15cf0;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_15cf0,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108fa;
    ptr_fhandle = (filemgr *)(auStack_15b58 + 0x48);
    pfVar10 = (fdb_kvs_handle *)auStack_15ce0;
    handle_00 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_15d08 = (fdb_kvs_handle *)0x110252;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)handle_00 & 0xffffffff);
      pfStack_15d08 = (fdb_kvs_handle *)0x11025a;
      sVar5 = strlen((char *)ptr_fhandle);
      pfStack_15d08 = (fdb_kvs_handle *)0x110279;
      fdb_doc_create((fdb_doc **)pfVar10,ptr_fhandle,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_15d08 = (fdb_kvs_handle *)0x110288;
      pcVar22 = (char *)auStack_15cf0;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_15cf0,(fdb_doc *)auStack_15ce0._0_8_);
      _Var19._M_i = auStack_15ce0._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108be;
      pfVar8 = (fdb_kvs_handle *)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_15ce0._0_8_ + 0x40))->
               seqtree;
      pcVar12 = *(char **)(*(long *)(&afStack_15810[0].kvs_config.create_if_missing +
                                    (long)handle_00 * 8) + 0x40);
      pfStack_15d08 = (fdb_kvs_handle *)0x1102b4;
      iVar4 = bcmp(pfVar8,pcVar12,(size_t)*(void **)(auStack_15ce0._0_8_ + 0x10));
      if (iVar4 != 0) goto LAB_001108b3;
      pfStack_15d08 = (fdb_kvs_handle *)0x1102c4;
      fdb_doc_free((fdb_doc *)_Var19._M_i);
      handle_00 = (fdb_kvs_handle *)&(handle_00->kvs_config).field_0x1;
      doc._M_i = _Var19._M_i;
    } while (handle_00 != (fdb_kvs_handle *)0x2710);
    pfStack_15d08 = (fdb_kvs_handle *)0x1102de;
    fdb_close((fdb_file_handle *)auStack_15cf8);
    pcVar22 = auStack_15cd0;
    pfStack_15d08 = (fdb_kvs_handle *)0x1102f7;
    fVar3 = fdb_open((fdb_file_handle **)pcVar22,"compact_test_less",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108ff;
    pfStack_15d08 = (fdb_kvs_handle *)0x110313;
    pcVar22 = (char *)auStack_15cd0._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_15cd0._0_8_,
                       (fdb_kvs_handle **)&aStack_15c90.seqtree,&fStack_15cc0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110904;
    uStack_15c42 = uStack_15c42 & 0xff;
    pcVar22 = auStack_15ce0 + 8;
    pfStack_15d08 = (fdb_kvs_handle *)0x110338;
    fVar3 = fdb_open((fdb_file_handle **)pcVar22,"compact_test_non",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110909;
    pfStack_15d08 = (fdb_kvs_handle *)0x110354;
    pcVar22 = (char *)auStack_15ce0._8_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_15ce0._8_8_,(fdb_kvs_handle **)&_Stack_15c98,
                       &fStack_15cc0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011090e;
    uStack_15c42 = uStack_15c42 & 0xff00;
    pcVar22 = auStack_15ce8;
    pfStack_15d08 = (fdb_kvs_handle *)0x110379;
    fVar3 = fdb_open((fdb_file_handle **)pcVar22,"compact_test_manual",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110913;
    pfStack_15d08 = (fdb_kvs_handle *)0x110395;
    pcVar22 = (char *)auStack_15ce8;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_15ce8,(fdb_kvs_handle **)&aStack_15ca0.seqtree,
                       &fStack_15cc0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110918;
    uStack_15c42 = 0x1e01;
    pcVar22 = auStack_15cf8;
    pfStack_15d08 = (fdb_kvs_handle *)0x1103bc;
    fVar3 = fdb_open((fdb_file_handle **)pcVar22,"compact_test",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011091d;
    pfStack_15d08 = (fdb_kvs_handle *)0x1103d8;
    pcVar22 = (char *)auStack_15cf8;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_15cf8,(fdb_kvs_handle **)auStack_15cf0,
                       &fStack_15cc0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110922;
    pfStack_15d08 = (fdb_kvs_handle *)0x1103f8;
    pcVar22 = (char *)auStack_15cf0;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_15cf0,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110927;
    _Var19._M_i = 0;
    pfStack_15d08 = (fdb_kvs_handle *)0x110416;
    printf("wait for %d seconds..\n");
    pcVar12 = auStack_15b78;
    pfStack_15d08 = (fdb_kvs_handle *)0x110428;
    gettimeofday((timeval *)pcVar12,(__timezone_ptr_t)0x0);
    tVar25.tv_usec = auStack_15b78._8_8_;
    tVar25.tv_sec = auStack_15b78._0_8_;
    handle_00 = (fdb_kvs_handle *)auStack_15c80;
    while( true ) {
      pfStack_15d08 = (fdb_kvs_handle *)0x110449;
      fdb_set((fdb_kvs_handle *)auStack_15cf0,
              *(fdb_doc **)(&afStack_15810[0].kvs_config.create_if_missing + _Var19._M_i * 8));
      pfStack_15d08 = (fdb_kvs_handle *)0x110455;
      fdb_commit((fdb_file_handle *)auStack_15cf8,'\0');
      if ((ushort)((ushort)((short)_Var19._M_i * 0x5c29) >> 2 | (short)_Var19._M_i * 0x4000) < 0x290
         ) {
        pfStack_15d08 = (fdb_kvs_handle *)0x11047c;
        fdb_set((fdb_kvs_handle *)aStack_15c90.seqtree,
                *(fdb_doc **)(&afStack_15810[0].kvs_config.create_if_missing + _Var19._M_i * 8));
        pfStack_15d08 = (fdb_kvs_handle *)0x110488;
        fdb_commit((fdb_file_handle *)auStack_15cd0._0_8_,'\0');
      }
      pfStack_15d08 = (fdb_kvs_handle *)0x11049a;
      fdb_set((fdb_kvs_handle *)_Stack_15c98._M_i,
              *(fdb_doc **)(&afStack_15810[0].kvs_config.create_if_missing + _Var19._M_i * 8));
      pfStack_15d08 = (fdb_kvs_handle *)0x1104a6;
      fdb_commit((fdb_file_handle *)auStack_15ce0._8_8_,'\0');
      pfStack_15d08 = (fdb_kvs_handle *)0x1104b8;
      fdb_set((fdb_kvs_handle *)aStack_15ca0.seqtree,
              *(fdb_doc **)(&afStack_15810[0].kvs_config.create_if_missing + _Var19._M_i * 8));
      pfStack_15d08 = (fdb_kvs_handle *)0x1104c4;
      fdb_commit((fdb_file_handle *)auStack_15ce8,'\0');
      pfStack_15d08 = (fdb_kvs_handle *)0x1104ce;
      gettimeofday((timeval *)handle_00,(__timezone_ptr_t)0x0);
      pfStack_15d08 = (fdb_kvs_handle *)0x1104e9;
      tVar24 = _utime_gap(tVar25,(timeval)auStack_15c80);
      if ((ulong)auStack_15cd0._8_8_ <= (fdb_kvs_handle *)tVar24.tv_sec) break;
      _Var19._M_i = (__int_type_conflict)&(((fdb_kvs_handle *)_Var19._M_i)->kvs_config).field_0x1;
      if ((undefined1 *)_Var19._M_i == (undefined1 *)0x2710) {
        _Var19._M_i = 0;
      }
    }
    pfStack_15d08 = (fdb_kvs_handle *)0x110517;
    pcVar22 = (char *)auStack_15cf8;
    fVar3 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_15cf8,0x3c);
    ptr_fhandle = (filemgr *)auStack_15b78._0_8_;
    pfVar10 = (fdb_kvs_handle *)auStack_15b78._8_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011092c;
    pfStack_15d08 = (fdb_kvs_handle *)0x11052e;
    pcVar22 = (char *)auStack_15cf8;
    fVar3 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_15cf8,1);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110931;
    pfStack_15d08 = (fdb_kvs_handle *)0x110542;
    pcVar22 = (char *)auStack_15ce0._8_8_;
    fVar3 = fdb_compact((fdb_file_handle *)auStack_15ce0._8_8_,(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110936;
    pfStack_15d08 = (fdb_kvs_handle *)0x11055b;
    pcVar22 = (char *)auStack_15ce8;
    fVar3 = fdb_compact((fdb_file_handle *)auStack_15ce8,"compact_test_manual_compacted");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011093b;
    uStack_15c42 = uStack_15c42 & 0xff00;
    pcVar22 = auStack_15c88;
    pfStack_15d08 = (fdb_kvs_handle *)0x110580;
    fVar3 = fdb_open((fdb_file_handle **)pcVar22,"compact_test_manual_compacted",
                     (fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110940;
    pfStack_15d08 = (fdb_kvs_handle *)0x11059c;
    pcVar22 = (char *)auStack_15ce8;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_15ce8,'\x01',0x1e);
    if (fVar3 != FDB_RESULT_FILE_IS_BUSY) goto LAB_00110945;
    pfStack_15d08 = (fdb_kvs_handle *)0x1105af;
    fVar3 = fdb_close((fdb_file_handle *)auStack_15c88);
    pcVar22 = (char *)auStack_15c88;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011094a;
    pfStack_15d08 = (fdb_kvs_handle *)0x1105cb;
    pcVar22 = (char *)auStack_15ce8;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_15ce8,'\x01',10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011094f;
    pfStack_15d08 = (fdb_kvs_handle *)0x1105e7;
    pcVar22 = (char *)auStack_15ce8;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_15ce8,'\x01',0x1e);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110954;
    pfStack_15d08 = (fdb_kvs_handle *)0x1105f9;
    pcVar22 = (char *)auStack_15ce8;
    fVar3 = fdb_close((fdb_file_handle *)auStack_15ce8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110959;
    uStack_15c42 = CONCAT11(uStack_15c42._1_1_,1);
    pcVar22 = auStack_15ce8;
    pfStack_15d08 = (fdb_kvs_handle *)0x11061e;
    fVar3 = fdb_open((fdb_file_handle **)pcVar22,"compact_test_manual_compacted",
                     (fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011095e;
    pfStack_15d08 = (fdb_kvs_handle *)0x110634;
    pcVar22 = (char *)auStack_15ce0._8_8_;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_15ce0._8_8_,'\0',0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110963;
    pfStack_15d08 = (fdb_kvs_handle *)0x110646;
    pcVar22 = (char *)auStack_15ce0._8_8_;
    fVar3 = fdb_close((fdb_file_handle *)auStack_15ce0._8_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110968;
    uStack_15c42 = uStack_15c42 & 0xff00;
    pcVar22 = auStack_15ce0 + 8;
    pfStack_15d08 = (fdb_kvs_handle *)0x11066b;
    fVar3 = fdb_open((fdb_file_handle **)pcVar22,"compact_test_non",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011096d;
    pcVar12 = "compact_test_non.manual";
    pfStack_15d08 = (fdb_kvs_handle *)0x110687;
    fdb_compact((fdb_file_handle *)auStack_15ce0._8_8_,"compact_test_non.manual");
    ptr_fhandle = (filemgr *)auStack_15cf8;
    pfStack_15d08 = (fdb_kvs_handle *)0x110694;
    fdb_close((fdb_file_handle *)auStack_15cf8);
    pfStack_15d08 = (fdb_kvs_handle *)0x11069e;
    fdb_close((fdb_file_handle *)auStack_15cd0._0_8_);
    pfStack_15d08 = (fdb_kvs_handle *)0x1106a8;
    fdb_close((fdb_file_handle *)auStack_15ce8);
    uStack_15c42 = CONCAT11(uStack_15c42._1_1_,1);
    pfStack_15d08 = (fdb_kvs_handle *)0x1106bf;
    pcVar22 = (char *)ptr_fhandle;
    fVar3 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non.manual",
                     (fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110972;
    pcVar22 = "compact_test_non.manual";
    pfStack_15d08 = (fdb_kvs_handle *)0x1106dc;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110977;
    uStack_15c42 = uStack_15c42 & 0xff00;
    pcVar22 = auStack_15cf8;
    pfStack_15d08 = (fdb_kvs_handle *)0x110702;
    fVar3 = fdb_open((fdb_file_handle **)pcVar22,"compact_test_manual_compacted",
                     (fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_0011097c;
    pcVar22 = "compact_test_manual_compacted";
    pfStack_15d08 = (fdb_kvs_handle *)0x11071f;
    fVar3 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110981;
    uStack_15c42 = CONCAT11(uStack_15c42._1_1_,1);
    pcVar22 = "compact_test_manual_compacted";
    pfStack_15d08 = (fdb_kvs_handle *)0x110740;
    fVar3 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110986;
    uStack_15c42 = uStack_15c42 & 0xff00;
    pcVar22 = "compact_test_non.manual";
    pfStack_15d08 = (fdb_kvs_handle *)0x110760;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011098b;
    pfStack_15d08 = (fdb_kvs_handle *)0x110773;
    fdb_close((fdb_file_handle *)auStack_15ce0._8_8_);
    pfStack_15d08 = (fdb_kvs_handle *)0x110778;
    fVar3 = fdb_shutdown();
    pcVar22 = (char *)auStack_15ce0._8_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110990;
    pcVar22 = "compact_test_non.manual";
    pfStack_15d08 = (fdb_kvs_handle *)0x110794;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110995;
    fStack_15c4c = 2;
    pcVar22 = auStack_15cf8;
    pfStack_15d08 = (fdb_kvs_handle *)0x1107bc;
    fVar3 = fdb_open((fdb_file_handle **)pcVar22,"./compact_test_manual_compacted",
                     (fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099a;
    pcVar22 = auStack_15cf8;
    pfStack_15d08 = (fdb_kvs_handle *)0x1107de;
    fVar3 = fdb_open((fdb_file_handle **)pcVar22,"./compact_test_manual_compacted.meta",
                     (fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099f;
    pcVar22 = auStack_15cf8;
    pfStack_15d08 = (fdb_kvs_handle *)0x110800;
    fVar3 = fdb_open((fdb_file_handle **)pcVar22,"compact_test_non",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001109a4;
    pcVar22 = auStack_15cf8;
    pfStack_15d08 = (fdb_kvs_handle *)0x110822;
    fVar3 = fdb_open((fdb_file_handle **)pcVar22,"compact_test_non.manual",
                     (fdb_config *)auStack_15c70);
    if (fVar3 == FDB_RESULT_NO_SUCH_FILE) {
      lVar13 = 0;
      do {
        pfStack_15d08 = (fdb_kvs_handle *)0x11083a;
        fdb_doc_free(*(fdb_doc **)(&afStack_15810[0].kvs_config.create_if_missing + lVar13 * 8));
        lVar13 = lVar13 + 1;
      } while (lVar13 != 10000);
      pfStack_15d08 = (fdb_kvs_handle *)0x11084b;
      fdb_shutdown();
      pfStack_15d08 = (fdb_kvs_handle *)0x110850;
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pfStack_15d08 = (fdb_kvs_handle *)0x110881;
      fprintf(_stderr,pcVar12,"compaction daemon test");
      return;
    }
  }
  else {
LAB_001108c3:
    pfStack_15d08 = (fdb_kvs_handle *)0x1108c8;
    compaction_daemon_test();
LAB_001108c8:
    pfStack_15d08 = (fdb_kvs_handle *)0x1108cd;
    compaction_daemon_test();
LAB_001108cd:
    pfStack_15d08 = (fdb_kvs_handle *)0x1108d2;
    compaction_daemon_test();
LAB_001108d2:
    pfStack_15d08 = (fdb_kvs_handle *)0x1108d7;
    compaction_daemon_test();
LAB_001108d7:
    pfStack_15d08 = (fdb_kvs_handle *)0x1108dc;
    compaction_daemon_test();
LAB_001108dc:
    pfStack_15d08 = (fdb_kvs_handle *)0x1108e1;
    compaction_daemon_test();
LAB_001108e1:
    pfStack_15d08 = (fdb_kvs_handle *)0x1108e6;
    compaction_daemon_test();
LAB_001108e6:
    pfStack_15d08 = (fdb_kvs_handle *)0x1108eb;
    compaction_daemon_test();
    _Var19._M_i = doc._M_i;
LAB_001108eb:
    pfStack_15d08 = (fdb_kvs_handle *)0x1108f0;
    compaction_daemon_test();
LAB_001108f0:
    pfStack_15d08 = (fdb_kvs_handle *)0x1108f5;
    compaction_daemon_test();
LAB_001108f5:
    pfStack_15d08 = (fdb_kvs_handle *)0x1108fa;
    compaction_daemon_test();
LAB_001108fa:
    pfStack_15d08 = (fdb_kvs_handle *)0x1108ff;
    compaction_daemon_test();
LAB_001108ff:
    pfStack_15d08 = (fdb_kvs_handle *)0x110904;
    compaction_daemon_test();
LAB_00110904:
    pfStack_15d08 = (fdb_kvs_handle *)0x110909;
    compaction_daemon_test();
LAB_00110909:
    pfStack_15d08 = (fdb_kvs_handle *)0x11090e;
    compaction_daemon_test();
LAB_0011090e:
    pfStack_15d08 = (fdb_kvs_handle *)0x110913;
    compaction_daemon_test();
LAB_00110913:
    pfStack_15d08 = (fdb_kvs_handle *)0x110918;
    compaction_daemon_test();
LAB_00110918:
    pfStack_15d08 = (fdb_kvs_handle *)0x11091d;
    compaction_daemon_test();
LAB_0011091d:
    pfStack_15d08 = (fdb_kvs_handle *)0x110922;
    compaction_daemon_test();
LAB_00110922:
    pfStack_15d08 = (fdb_kvs_handle *)0x110927;
    compaction_daemon_test();
LAB_00110927:
    pfStack_15d08 = (fdb_kvs_handle *)0x11092c;
    compaction_daemon_test();
LAB_0011092c:
    pfStack_15d08 = (fdb_kvs_handle *)0x110931;
    compaction_daemon_test();
LAB_00110931:
    pfStack_15d08 = (fdb_kvs_handle *)0x110936;
    compaction_daemon_test();
LAB_00110936:
    pfStack_15d08 = (fdb_kvs_handle *)0x11093b;
    compaction_daemon_test();
LAB_0011093b:
    pfStack_15d08 = (fdb_kvs_handle *)0x110940;
    compaction_daemon_test();
LAB_00110940:
    pfStack_15d08 = (fdb_kvs_handle *)0x110945;
    compaction_daemon_test();
LAB_00110945:
    pfStack_15d08 = (fdb_kvs_handle *)0x11094a;
    compaction_daemon_test();
LAB_0011094a:
    pfStack_15d08 = (fdb_kvs_handle *)0x11094f;
    compaction_daemon_test();
LAB_0011094f:
    pfStack_15d08 = (fdb_kvs_handle *)0x110954;
    compaction_daemon_test();
LAB_00110954:
    pfStack_15d08 = (fdb_kvs_handle *)0x110959;
    compaction_daemon_test();
LAB_00110959:
    pfStack_15d08 = (fdb_kvs_handle *)0x11095e;
    compaction_daemon_test();
LAB_0011095e:
    pfStack_15d08 = (fdb_kvs_handle *)0x110963;
    compaction_daemon_test();
LAB_00110963:
    pfStack_15d08 = (fdb_kvs_handle *)0x110968;
    compaction_daemon_test();
LAB_00110968:
    pfStack_15d08 = (fdb_kvs_handle *)0x11096d;
    compaction_daemon_test();
LAB_0011096d:
    pfStack_15d08 = (fdb_kvs_handle *)0x110972;
    compaction_daemon_test();
LAB_00110972:
    pfStack_15d08 = (fdb_kvs_handle *)0x110977;
    compaction_daemon_test();
LAB_00110977:
    pfStack_15d08 = (fdb_kvs_handle *)0x11097c;
    compaction_daemon_test();
LAB_0011097c:
    pfStack_15d08 = (fdb_kvs_handle *)0x110981;
    compaction_daemon_test();
LAB_00110981:
    pfStack_15d08 = (fdb_kvs_handle *)0x110986;
    compaction_daemon_test();
LAB_00110986:
    pfStack_15d08 = (fdb_kvs_handle *)0x11098b;
    compaction_daemon_test();
LAB_0011098b:
    pfStack_15d08 = (fdb_kvs_handle *)0x110990;
    compaction_daemon_test();
LAB_00110990:
    pfStack_15d08 = (fdb_kvs_handle *)0x110995;
    compaction_daemon_test();
LAB_00110995:
    pfStack_15d08 = (fdb_kvs_handle *)0x11099a;
    compaction_daemon_test();
LAB_0011099a:
    pfStack_15d08 = (fdb_kvs_handle *)0x11099f;
    compaction_daemon_test();
LAB_0011099f:
    pfStack_15d08 = (fdb_kvs_handle *)0x1109a4;
    compaction_daemon_test();
LAB_001109a4:
    pfStack_15d08 = (fdb_kvs_handle *)0x1109a9;
    compaction_daemon_test();
  }
  pfStack_15d08 = (fdb_kvs_handle *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_15ea0 = (fdb_kvs_handle *)0x1109ce;
  pfStack_15d30 = (filemgr *)pcVar12;
  pfStack_15d28 = handle_00;
  pfStack_15d20 = (fdb_kvs_handle *)_Var19._M_i;
  pfStack_15d18 = ptr_fhandle;
  pfStack_15d10 = pfVar10;
  pfStack_15d08 = pfVar8;
  gettimeofday(&tStack_15e50,(__timezone_ptr_t)0x0);
  pfStack_15ea0 = (fdb_kvs_handle *)0x1109d3;
  memleak_start();
  pfStack_15ea0 = (fdb_kvs_handle *)0x1109df;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_15ea0 = (fdb_kvs_handle *)0x1109ec;
  fdb_get_default_config();
  uStack_15dfa = 1;
  uStack_15df0._0_2_ = 1;
  uStack_15df0._2_2_ = 0;
  uStack_15df0._4_4_ = 0;
  pfStack_15ea0 = (fdb_kvs_handle *)0x110a0d;
  fVar3 = fdb_open(&pfStack_15e90,"compact_test",(fdb_config *)(auStack_15e40 + 0x18));
  pfVar20 = (fdb_config *)(auStack_15e40 + 0x18);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfVar20 = (fdb_config *)auStack_15e40;
    pfStack_15ea0 = (fdb_kvs_handle *)0x110a22;
    fdb_get_default_kvs_config();
    pfStack_15ea0 = (fdb_kvs_handle *)0x110a34;
    fVar3 = fdb_kvs_open_default(pfStack_15e90,&pfStack_15e88,(fdb_kvs_config *)pfVar20);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110b65;
    pfStack_15ea0 = (fdb_kvs_handle *)0x110a4b;
    gettimeofday(&tStack_15e60,(__timezone_ptr_t)0x0);
    pfStack_15ea0 = (fdb_kvs_handle *)0x110a5b;
    printf("wait for %d seconds..\n",(ulong)pcVar22 & 0xffffffff);
    tVar24.tv_usec = tStack_15e60.tv_usec;
    tVar24.tv_sec = tStack_15e60.tv_sec;
    _Var19._M_i = (long)&atStack_15e80[1].tv_sec + 1;
    pfVar8 = (fdb_kvs_handle *)0x0;
    do {
      iVar4 = (int)pfVar8;
      pfStack_15ea0 = (fdb_kvs_handle *)0x110a7c;
      sprintf((char *)_Var19._M_i,"%d",pfVar8);
      handle_00 = pfStack_15e88;
      pfStack_15ea0 = (fdb_kvs_handle *)0x110a89;
      sVar5 = strlen((char *)_Var19._M_i);
      pfStack_15ea0 = (fdb_kvs_handle *)0x110aa4;
      fVar3 = fdb_set_kv(handle_00,(void *)_Var19._M_i,sVar5,"value",5);
      pfVar20 = (fdb_config *)tStack_15e60.tv_sec;
      pfVar10 = (fdb_kvs_handle *)tStack_15e60.tv_usec;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00110b5b:
        pfStack_15ea0 = (fdb_kvs_handle *)0x110b60;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b60;
      }
      pfStack_15ea0 = (fdb_kvs_handle *)0x110ab8;
      fVar3 = fdb_commit(pfStack_15e90,'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_15ea0 = (fdb_kvs_handle *)0x110b5b;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b5b;
      }
      pfStack_15ea0 = (fdb_kvs_handle *)0x110acc;
      gettimeofday((timeval *)atStack_15e80,(__timezone_ptr_t)0x0);
      pfStack_15ea0 = (fdb_kvs_handle *)0x110ae1;
      tVar25 = _utime_gap(tVar24,atStack_15e80[0]);
    } while (((filemgr *)tVar25.tv_sec < pcVar22) &&
            (pfVar8 = (fdb_kvs_handle *)(ulong)(iVar4 + 1), iVar4 != 99999));
    pfStack_15ea0 = (fdb_kvs_handle *)0x110b01;
    fVar3 = fdb_close(pfStack_15e90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110b6a;
    pfStack_15ea0 = (fdb_kvs_handle *)0x110b0a;
    fVar3 = fdb_shutdown();
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_15ea0 = (fdb_kvs_handle *)0x110b13;
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pfStack_15ea0 = (fdb_kvs_handle *)0x110b44;
      fprintf(_stderr,pcVar12,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110b60:
    pfStack_15ea0 = (fdb_kvs_handle *)0x110b65;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b65:
    pfStack_15ea0 = (fdb_kvs_handle *)0x110b6a;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b6a:
    pfStack_15ea0 = (fdb_kvs_handle *)0x110b6f;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_15ea0 = (fdb_kvs_handle *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_15ec8 = (filemgr *)pcVar22;
  pfStack_15ec0 = handle_00;
  pfStack_15eb8 = (fdb_kvs_handle *)_Var19._M_i;
  pfStack_15eb0 = pfVar20;
  pfStack_15ea8 = pfVar10;
  pfStack_15ea0 = pfVar8;
  gettimeofday(&tStack_161d0,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_16240._32_8_ = (btree *)0x0;
  auStack_16240._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_15fc0.wal_threshold = 0x1000;
  fStack_15fc0.compaction_mode = '\x01';
  fStack_15fc0.compaction_threshold = '\n';
  fStack_15fc0.compactor_sleep_duration = 1;
  info = (fdb_file_info *)0x14d0c5;
  pfVar8 = (fdb_kvs_handle *)&pfStack_16260;
  kvs_config_01 = (fdb_file_info *)0x1;
  fVar3 = fdb_open_custom_cmp((fdb_file_handle **)pfVar8,"compact_test",&fStack_15fc0,1,
                              (char **)(auStack_16240 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_16240 + 0x18),(void **)0x0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_16240._16_8_ = afStack_161c0[0].doc_count;
    auStack_16240._0_8_ = afStack_161c0[0].filename;
    auStack_16240._8_8_ = afStack_161c0[0].new_filename;
    info = (fdb_file_info *)auStack_16258;
    pfVar8 = pfStack_16260;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_16260,(fdb_kvs_handle **)info,
                       (fdb_kvs_config *)auStack_16240);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f6c;
    info = (fdb_file_info *)auStack_16248;
    kvs_config_01 = (fdb_file_info *)auStack_16240;
    pfVar8 = pfStack_16260;
    fVar3 = fdb_kvs_open((fdb_file_handle *)pfStack_16260,(fdb_kvs_handle **)info,"db",
                         (fdb_kvs_config *)kvs_config_01);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f71;
    uVar18 = 0;
    do {
      sprintf((char *)afStack_161c0,"key%06d",uVar18);
      sprintf((char *)afStack_160c0,"body%06d",uVar18);
      pfVar8 = (fdb_kvs_handle *)auStack_16258._0_8_;
      sVar5 = strlen((char *)afStack_161c0);
      sVar6 = strlen((char *)afStack_160c0);
      kvs_config_01 = afStack_160c0;
      info = afStack_161c0;
      fVar3 = fdb_set_kv(pfVar8,afStack_161c0,sVar5,afStack_160c0,sVar6);
      handle = auStack_16248;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00110f53:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110f58;
      }
      sVar5 = strlen((char *)afStack_161c0);
      sVar6 = strlen((char *)afStack_160c0);
      kvs_config_01 = afStack_160c0;
      info = afStack_161c0;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)handle,afStack_161c0,sVar5,afStack_160c0,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar8 = (fdb_kvs_handle *)handle;
        goto LAB_00110f53;
      }
      uVar15 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar15;
    } while (uVar15 != 10000);
    kvs_config_01 = (fdb_file_info *)auStack_16240;
    auStack_16240._8_8_ = _compact_test_keycmp;
    info = (fdb_file_info *)(auStack_16258 + 8);
    pfVar8 = pfStack_16260;
    fVar3 = fdb_kvs_open((fdb_file_handle *)pfStack_16260,(fdb_kvs_handle **)info,"db_custom",
                         (fdb_kvs_config *)kvs_config_01);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f76;
    info = afStack_161c0;
    sprintf((char *)info,"key%06d",0);
    kvs_config_01 = afStack_160c0;
    sprintf((char *)kvs_config_01,"body%06d",0);
    sVar5 = strlen((char *)info);
    sVar6 = strlen((char *)kvs_config_01);
    fVar3 = fdb_set_kv((fdb_kvs_handle *)auStack_16258._8_8_,info,sVar5,kvs_config_01,sVar6);
    pfVar8 = (fdb_kvs_handle *)auStack_16258._8_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f7b;
    info = (fdb_file_info *)0x0;
    pfVar8 = pfStack_16260;
    fVar3 = fdb_commit((fdb_file_handle *)pfStack_16260,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f80;
    uVar18 = 0;
    uVar21 = 0;
    do {
      sprintf((char *)afStack_161c0,"key%06d",uVar21);
      sprintf((char *)afStack_160c0,"body%06d",uVar21);
      pfVar8 = (fdb_kvs_handle *)auStack_16258._0_8_;
      sVar5 = strlen((char *)afStack_161c0);
      sVar6 = strlen((char *)afStack_160c0);
      kvs_config_01 = afStack_160c0;
      info = afStack_161c0;
      fVar3 = fdb_set_kv(pfVar8,afStack_161c0,sVar5,afStack_160c0,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      info = (fdb_file_info *)(auStack_16240 + 0x28);
      pfVar8 = pfStack_16260;
      fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_16260,info);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f58;
      if (uVar18 < uStack_161f0) {
        uVar18 = uStack_161f0;
      }
      uVar15 = (int)uVar21 + 1;
      uVar21 = (ulong)uVar15;
    } while (uVar15 != 10000);
    info = (fdb_file_info *)0x0;
    pfVar8 = pfStack_16260;
    fVar3 = fdb_commit((fdb_file_handle *)pfStack_16260,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f85;
    info = (fdb_file_info *)(auStack_16240 + 0x28);
    pfVar8 = pfStack_16260;
    fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_16260,info);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f8a;
    if (uVar18 < uStack_161f0) {
      uVar18 = uStack_161f0;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar18);
    do {
      sleep(1);
      info = (fdb_file_info *)(auStack_16240 + 0x28);
      pfVar8 = pfStack_16260;
      fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_16260,
                                (fdb_file_info *)(auStack_16240 + 0x28));
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f62;
    } while (uVar18 <= uStack_161f0);
    fVar3 = fdb_close((fdb_file_handle *)pfStack_16260);
    pfVar8 = pfStack_16260;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_shutdown();
      pfVar8 = pfStack_16260;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar12 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar12 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar12,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110f94;
    }
  }
  else {
LAB_00110f67:
    auto_compaction_with_custom_cmp_function();
LAB_00110f6c:
    auto_compaction_with_custom_cmp_function();
LAB_00110f71:
    auto_compaction_with_custom_cmp_function();
LAB_00110f76:
    auto_compaction_with_custom_cmp_function();
LAB_00110f7b:
    auto_compaction_with_custom_cmp_function();
LAB_00110f80:
    auto_compaction_with_custom_cmp_function();
LAB_00110f85:
    auto_compaction_with_custom_cmp_function();
LAB_00110f8a:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110f94:
  auto_compaction_with_custom_cmp_function();
  if (info == kvs_config_01) {
    memcmp(pfVar8,__s2,(size_t)info);
    return;
  }
  if (info < kvs_config_01) {
    kvs_config_01 = info;
  }
  memcmp(pfVar8,__s2,(size_t)kvs_config_01);
  return;
LAB_0010eb2a:
  pfStack_590 = (fdb_kvs_handle *)0x10eb2f;
  compact_upto_test();
  pcVar23 = pcVar22;
LAB_0010eb2f:
  pfStack_590 = (fdb_kvs_handle *)0x10eb34;
  compact_upto_test();
LAB_0010eb34:
  pfStack_590 = (fdb_kvs_handle *)0x10eb39;
  compact_upto_test();
LAB_0010eb39:
  pfStack_590 = (fdb_kvs_handle *)0x10eb3e;
  compact_upto_test();
LAB_0010eb3e:
  pfStack_590 = (fdb_kvs_handle *)0x10eb43;
  compact_upto_test();
  goto LAB_0010eb43;
LAB_001108a3:
  pfStack_15d08 = (fdb_kvs_handle *)0x1108ae;
  compaction_daemon_test();
  doc._M_i = _Var19._M_i;
LAB_001108ae:
  _Var19._M_i = doc._M_i;
  pfStack_15d08 = (fdb_kvs_handle *)0x1108b3;
  compaction_daemon_test();
LAB_001108b3:
  pfStack_15d08 = (fdb_kvs_handle *)0x1108be;
  pcVar22 = pcVar12;
  compaction_daemon_test();
  doc._M_i = _Var19._M_i;
LAB_001108be:
  pfVar10 = (fdb_kvs_handle *)auStack_15ce0;
  ptr_fhandle = (filemgr *)(auStack_15b58 + 0x48);
  pfStack_15d08 = (fdb_kvs_handle *)0x1108c3;
  compaction_daemon_test();
  goto LAB_001108c3;
LAB_00110f58:
  auto_compaction_with_custom_cmp_function();
LAB_00110f5d:
  auto_compaction_with_custom_cmp_function();
LAB_00110f62:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110f67;
}

Assistant:

void compact_upto_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;
    fdb_snapshot_info_t *markers;
    fdb_kvs_handle *snapshot;
    uint64_t num_markers;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];
    char compact_filename[32];

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    // since this test requires static number of markers,
    // disable block reusing
    fconfig.block_reusing_threshold = 0;

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

   // ------- Setup test ----------------------------------
   // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 9
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit again without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "compact_upto_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    if (!multi_kv) {
        TEST_CHK(num_markers == 4);
        for (r = 0; (uint64_t)r < num_markers; ++r) {
            TEST_CHK(markers[r].num_kvs_markers == 1);
            TEST_CHK(markers[r].kvs_markers[0].seqnum ==
                     (fdb_seqnum_t)(n - r*5));
        }
        r = 1; // Test compacting upto sequence number 15
        sprintf(compact_filename, "compact_test_compact%d", r);
        status = fdb_compact_upto(dbfile, compact_filename,
                                  markers[r].marker);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // create a snapshot
        status = fdb_snapshot_open(db[0], &snapshot,
                                   markers[r].kvs_markers[0].seqnum);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // close snapshot
        fdb_kvs_close(snapshot);
    } else {
        TEST_CHK(num_markers == 8);
        for (r = 0; r < num_kvs; ++r) {
            TEST_CHK(markers[r].num_kvs_markers == num_kvs+1);
            for (i = 0; i < num_kvs; ++i) {
                TEST_CHK(markers[r].kvs_markers[i].seqnum
                         == (fdb_seqnum_t)(n - r*5));
                sprintf(kv_name, "kv%d", i);
                TEST_CMP(markers[r].kvs_markers[i].kv_store_name, kv_name, 3);
            }
        }
        i = r = 1;
        sprintf(compact_filename, "compact_test_compact%d", i);
        status = fdb_compact_upto(dbfile, compact_filename,
                markers[i].marker);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // create a snapshot
        status = fdb_snapshot_open(db[r], &snapshot,
                markers[i].kvs_markers[r].seqnum);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // close snapshot
        fdb_kvs_close(snapshot);
    }

    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "compact upto marker in file test %s", multi_kv ?
                                                           "multiple kv mode:"
                                                         : "single kv mode:");
    TEST_RESULT(bodybuf);
}